

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  uint uVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  long lVar70;
  byte bVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  float t1;
  undefined1 auVar78 [16];
  float fVar75;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined4 uVar76;
  undefined1 auVar82 [16];
  float fVar77;
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar103;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar97 [16];
  float fVar102;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 extraout_var [56];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar144;
  float fVar157;
  float fVar158;
  vfloat4 b0;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar159;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar163;
  undefined8 uVar164;
  float fVar184;
  vfloat4 b0_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar182;
  float fVar186;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar183;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar185;
  float fVar187;
  undefined1 auVar181 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  vfloat4 a0_2;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  vfloat4 a0_3;
  undefined1 auVar231 [16];
  float fVar241;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 in_ZMM10 [64];
  undefined1 auVar239 [64];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  float fVar252;
  vfloat4 a0_1;
  undefined1 auVar253 [16];
  float fVar266;
  undefined1 auVar254 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar264;
  float fVar265;
  undefined1 in_ZMM12 [64];
  undefined1 auVar263 [64];
  vfloat4 a0;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_678 [16];
  float local_638;
  float fStack_634;
  undefined1 local_5e8 [8];
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  RTCFilterFunctionNArguments local_538;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  uint auStack_3e8 [4];
  uint local_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  uint uStack_288;
  float afStack_284 [7];
  RTCHitN local_268 [16];
  undefined1 local_258 [16];
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [32];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar69;
  undefined1 auVar101 [64];
  undefined1 auVar126 [32];
  
  PVar7 = prim[1];
  uVar74 = (ulong)(byte)PVar7;
  fVar75 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar13 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  auVar78._0_4_ = fVar75 * auVar13._0_4_;
  auVar78._4_4_ = fVar75 * auVar13._4_4_;
  auVar78._8_4_ = fVar75 * auVar13._8_4_;
  auVar78._12_4_ = fVar75 * auVar13._12_4_;
  auVar211._0_4_ = fVar75 * auVar83._0_4_;
  auVar211._4_4_ = fVar75 * auVar83._4_4_;
  auVar211._8_4_ = fVar75 * auVar83._8_4_;
  auVar211._12_4_ = fVar75 * auVar83._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar74 * 4 + 6);
  auVar84 = vpmovsxbd_avx2(auVar13);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar74 * 5 + 6);
  auVar14 = vpmovsxbd_avx2(auVar83);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar74 * 6 + 6);
  auVar15 = vpmovsxbd_avx2(auVar110);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar16 = vpmovsxbd_avx2(auVar3);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar17 = vpmovsxbd_avx2(auVar4);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar74 + 6);
  auVar18 = vpmovsxbd_avx2(auVar5);
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar68 = (ulong)(uint)((int)(uVar74 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar19 = vpmovsxbd_avx2(auVar6);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar68 + uVar74 + 6);
  auVar20 = vpmovsxbd_avx2(auVar221);
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar68 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar292._8_8_ = 0;
  auVar292._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar262 = vpmovsxbd_avx2(auVar292);
  auVar262 = vcvtdq2ps_avx(auVar262);
  auVar284._4_4_ = auVar211._0_4_;
  auVar284._0_4_ = auVar211._0_4_;
  auVar284._8_4_ = auVar211._0_4_;
  auVar284._12_4_ = auVar211._0_4_;
  auVar284._16_4_ = auVar211._0_4_;
  auVar284._20_4_ = auVar211._0_4_;
  auVar284._24_4_ = auVar211._0_4_;
  auVar284._28_4_ = auVar211._0_4_;
  auVar13 = vmovshdup_avx(auVar211);
  uVar164 = auVar13._0_8_;
  auVar295._8_8_ = uVar164;
  auVar295._0_8_ = uVar164;
  auVar295._16_8_ = uVar164;
  auVar295._24_8_ = uVar164;
  auVar13 = vshufps_avx(auVar211,auVar211,0xaa);
  fVar75 = auVar13._0_4_;
  auVar263._0_4_ = fVar75 * auVar15._0_4_;
  fVar144 = auVar13._4_4_;
  auVar263._4_4_ = fVar144 * auVar15._4_4_;
  auVar263._8_4_ = fVar75 * auVar15._8_4_;
  auVar263._12_4_ = fVar144 * auVar15._12_4_;
  auVar263._16_4_ = fVar75 * auVar15._16_4_;
  auVar263._20_4_ = fVar144 * auVar15._20_4_;
  auVar263._28_36_ = in_ZMM12._28_36_;
  auVar263._24_4_ = fVar75 * auVar15._24_4_;
  auVar239._0_4_ = auVar18._0_4_ * fVar75;
  auVar239._4_4_ = auVar18._4_4_ * fVar144;
  auVar239._8_4_ = auVar18._8_4_ * fVar75;
  auVar239._12_4_ = auVar18._12_4_ * fVar144;
  auVar239._16_4_ = auVar18._16_4_ * fVar75;
  auVar239._20_4_ = auVar18._20_4_ * fVar144;
  auVar239._28_36_ = in_ZMM10._28_36_;
  auVar239._24_4_ = auVar18._24_4_ * fVar75;
  auVar229._0_4_ = auVar262._0_4_ * fVar75;
  auVar229._4_4_ = auVar262._4_4_ * fVar144;
  auVar229._8_4_ = auVar262._8_4_ * fVar75;
  auVar229._12_4_ = auVar262._12_4_ * fVar144;
  auVar229._16_4_ = auVar262._16_4_ * fVar75;
  auVar229._20_4_ = auVar262._20_4_ * fVar144;
  auVar229._24_4_ = auVar262._24_4_ * fVar75;
  auVar229._28_4_ = 0;
  auVar13 = vfmadd231ps_fma(auVar263._0_32_,auVar295,auVar14);
  auVar83 = vfmadd231ps_fma(auVar239._0_32_,auVar295,auVar17);
  auVar110 = vfmadd231ps_fma(auVar229,auVar20,auVar295);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar284,auVar84);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar284,auVar16);
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar19,auVar284);
  auVar285._4_4_ = auVar78._0_4_;
  auVar285._0_4_ = auVar78._0_4_;
  auVar285._8_4_ = auVar78._0_4_;
  auVar285._12_4_ = auVar78._0_4_;
  auVar285._16_4_ = auVar78._0_4_;
  auVar285._20_4_ = auVar78._0_4_;
  auVar285._24_4_ = auVar78._0_4_;
  auVar285._28_4_ = auVar78._0_4_;
  auVar13 = vmovshdup_avx(auVar78);
  uVar164 = auVar13._0_8_;
  auVar296._8_8_ = uVar164;
  auVar296._0_8_ = uVar164;
  auVar296._16_8_ = uVar164;
  auVar296._24_8_ = uVar164;
  auVar13 = vshufps_avx(auVar78,auVar78,0xaa);
  fVar75 = auVar13._0_4_;
  auVar203._0_4_ = fVar75 * auVar15._0_4_;
  fVar144 = auVar13._4_4_;
  auVar203._4_4_ = fVar144 * auVar15._4_4_;
  auVar203._8_4_ = fVar75 * auVar15._8_4_;
  auVar203._12_4_ = fVar144 * auVar15._12_4_;
  auVar203._16_4_ = fVar75 * auVar15._16_4_;
  auVar203._20_4_ = fVar144 * auVar15._20_4_;
  auVar203._24_4_ = fVar75 * auVar15._24_4_;
  auVar203._28_4_ = 0;
  auVar23._4_4_ = auVar18._4_4_ * fVar144;
  auVar23._0_4_ = auVar18._0_4_ * fVar75;
  auVar23._8_4_ = auVar18._8_4_ * fVar75;
  auVar23._12_4_ = auVar18._12_4_ * fVar144;
  auVar23._16_4_ = auVar18._16_4_ * fVar75;
  auVar23._20_4_ = auVar18._20_4_ * fVar144;
  auVar23._24_4_ = auVar18._24_4_ * fVar75;
  auVar23._28_4_ = auVar15._28_4_;
  auVar15._4_4_ = auVar262._4_4_ * fVar144;
  auVar15._0_4_ = auVar262._0_4_ * fVar75;
  auVar15._8_4_ = auVar262._8_4_ * fVar75;
  auVar15._12_4_ = auVar262._12_4_ * fVar144;
  auVar15._16_4_ = auVar262._16_4_ * fVar75;
  auVar15._20_4_ = auVar262._20_4_ * fVar144;
  auVar15._24_4_ = auVar262._24_4_ * fVar75;
  auVar15._28_4_ = fVar144;
  auVar13 = vfmadd231ps_fma(auVar203,auVar296,auVar14);
  auVar4 = vfmadd231ps_fma(auVar23,auVar296,auVar17);
  auVar5 = vfmadd231ps_fma(auVar15,auVar296,auVar20);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar285,auVar84);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar285,auVar16);
  auVar113._8_4_ = 0x7fffffff;
  auVar113._0_8_ = 0x7fffffff7fffffff;
  auVar113._12_4_ = 0x7fffffff;
  auVar113._16_4_ = 0x7fffffff;
  auVar113._20_4_ = 0x7fffffff;
  auVar113._24_4_ = 0x7fffffff;
  auVar113._28_4_ = 0x7fffffff;
  auVar141._8_4_ = 0x219392ef;
  auVar141._0_8_ = 0x219392ef219392ef;
  auVar141._12_4_ = 0x219392ef;
  auVar141._16_4_ = 0x219392ef;
  auVar141._20_4_ = 0x219392ef;
  auVar141._24_4_ = 0x219392ef;
  auVar141._28_4_ = 0x219392ef;
  auVar84 = vandps_avx(ZEXT1632(auVar3),auVar113);
  auVar84 = vcmpps_avx(auVar84,auVar141,1);
  auVar14 = vblendvps_avx(ZEXT1632(auVar3),auVar141,auVar84);
  auVar84 = vandps_avx(ZEXT1632(auVar83),auVar113);
  auVar84 = vcmpps_avx(auVar84,auVar141,1);
  auVar15 = vblendvps_avx(ZEXT1632(auVar83),auVar141,auVar84);
  auVar84 = vandps_avx(ZEXT1632(auVar110),auVar113);
  auVar84 = vcmpps_avx(auVar84,auVar141,1);
  auVar84 = vblendvps_avx(ZEXT1632(auVar110),auVar141,auVar84);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar285,auVar19);
  auVar16 = vrcpps_avx(auVar14);
  auVar155._8_4_ = 0x3f800000;
  auVar155._0_8_ = &DAT_3f8000003f800000;
  auVar155._12_4_ = 0x3f800000;
  auVar155._16_4_ = 0x3f800000;
  auVar155._20_4_ = 0x3f800000;
  auVar155._24_4_ = 0x3f800000;
  auVar155._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar14,auVar16,auVar155);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar16,auVar16);
  auVar14 = vrcpps_avx(auVar15);
  auVar83 = vfnmadd213ps_fma(auVar15,auVar14,auVar155);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar84);
  auVar110 = vfnmadd213ps_fma(auVar84,auVar14,auVar155);
  auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar14,auVar14);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 7 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar6));
  auVar16._4_4_ = auVar13._4_4_ * auVar84._4_4_;
  auVar16._0_4_ = auVar13._0_4_ * auVar84._0_4_;
  auVar16._8_4_ = auVar13._8_4_ * auVar84._8_4_;
  auVar16._12_4_ = auVar13._12_4_ * auVar84._12_4_;
  auVar16._16_4_ = auVar84._16_4_ * 0.0;
  auVar16._20_4_ = auVar84._20_4_ * 0.0;
  auVar16._24_4_ = auVar84._24_4_ * 0.0;
  auVar16._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 9 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar6));
  auVar17._4_4_ = auVar13._4_4_ * auVar84._4_4_;
  auVar17._0_4_ = auVar13._0_4_ * auVar84._0_4_;
  auVar17._8_4_ = auVar13._8_4_ * auVar84._8_4_;
  auVar17._12_4_ = auVar13._12_4_ * auVar84._12_4_;
  auVar17._16_4_ = auVar84._16_4_ * 0.0;
  auVar17._20_4_ = auVar84._20_4_ * 0.0;
  auVar17._24_4_ = auVar84._24_4_ * 0.0;
  auVar17._28_4_ = auVar84._28_4_;
  auVar98._1_3_ = 0;
  auVar98[0] = PVar7;
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar74 * -2 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar4));
  auVar18._4_4_ = auVar84._4_4_ * auVar83._4_4_;
  auVar18._0_4_ = auVar84._0_4_ * auVar83._0_4_;
  auVar18._8_4_ = auVar84._8_4_ * auVar83._8_4_;
  auVar18._12_4_ = auVar84._12_4_ * auVar83._12_4_;
  auVar18._16_4_ = auVar84._16_4_ * 0.0;
  auVar18._20_4_ = auVar84._20_4_ * 0.0;
  auVar18._24_4_ = auVar84._24_4_ * 0.0;
  auVar18._28_4_ = auVar84._28_4_;
  auVar84 = vcvtdq2ps_avx(auVar14);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar4));
  auVar19._4_4_ = auVar83._4_4_ * auVar84._4_4_;
  auVar19._0_4_ = auVar83._0_4_ * auVar84._0_4_;
  auVar19._8_4_ = auVar83._8_4_ * auVar84._8_4_;
  auVar19._12_4_ = auVar83._12_4_ * auVar84._12_4_;
  auVar19._16_4_ = auVar84._16_4_ * 0.0;
  auVar19._20_4_ = auVar84._20_4_ * 0.0;
  auVar19._24_4_ = auVar84._24_4_ * 0.0;
  auVar19._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 + uVar74 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar3));
  auVar20._4_4_ = auVar84._4_4_ * auVar110._4_4_;
  auVar20._0_4_ = auVar84._0_4_ * auVar110._0_4_;
  auVar20._8_4_ = auVar84._8_4_ * auVar110._8_4_;
  auVar20._12_4_ = auVar84._12_4_ * auVar110._12_4_;
  auVar20._16_4_ = auVar84._16_4_ * 0.0;
  auVar20._20_4_ = auVar84._20_4_ * 0.0;
  auVar20._24_4_ = auVar84._24_4_ * 0.0;
  auVar20._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x17 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar3));
  auVar262._4_4_ = auVar110._4_4_ * auVar84._4_4_;
  auVar262._0_4_ = auVar110._0_4_ * auVar84._0_4_;
  auVar262._8_4_ = auVar110._8_4_ * auVar84._8_4_;
  auVar262._12_4_ = auVar110._12_4_ * auVar84._12_4_;
  auVar262._16_4_ = auVar84._16_4_ * 0.0;
  auVar262._20_4_ = auVar84._20_4_ * 0.0;
  auVar262._24_4_ = auVar84._24_4_ * 0.0;
  auVar262._28_4_ = auVar84._28_4_;
  auVar84 = vpminsd_avx2(auVar16,auVar17);
  auVar14 = vpminsd_avx2(auVar18,auVar19);
  auVar84 = vmaxps_avx(auVar84,auVar14);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar204._4_4_ = uVar76;
  auVar204._0_4_ = uVar76;
  auVar204._8_4_ = uVar76;
  auVar204._12_4_ = uVar76;
  auVar204._16_4_ = uVar76;
  auVar204._20_4_ = uVar76;
  auVar204._24_4_ = uVar76;
  auVar204._28_4_ = uVar76;
  auVar14 = vpminsd_avx2(auVar20,auVar262);
  auVar14 = vmaxps_avx(auVar14,auVar204);
  auVar84 = vmaxps_avx(auVar84,auVar14);
  local_1d8._4_4_ = auVar84._4_4_ * 0.99999964;
  local_1d8._0_4_ = auVar84._0_4_ * 0.99999964;
  local_1d8._8_4_ = auVar84._8_4_ * 0.99999964;
  local_1d8._12_4_ = auVar84._12_4_ * 0.99999964;
  local_1d8._16_4_ = auVar84._16_4_ * 0.99999964;
  local_1d8._20_4_ = auVar84._20_4_ * 0.99999964;
  local_1d8._24_4_ = auVar84._24_4_ * 0.99999964;
  local_1d8._28_4_ = auVar14._28_4_;
  auVar84 = vpmaxsd_avx2(auVar16,auVar17);
  auVar14 = vpmaxsd_avx2(auVar18,auVar19);
  auVar84 = vminps_avx(auVar84,auVar14);
  auVar14 = vpmaxsd_avx2(auVar20,auVar262);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar114._4_4_ = uVar76;
  auVar114._0_4_ = uVar76;
  auVar114._8_4_ = uVar76;
  auVar114._12_4_ = uVar76;
  auVar114._16_4_ = uVar76;
  auVar114._20_4_ = uVar76;
  auVar114._24_4_ = uVar76;
  auVar114._28_4_ = uVar76;
  auVar14 = vminps_avx(auVar14,auVar114);
  auVar84 = vminps_avx(auVar84,auVar14);
  auVar24._4_4_ = auVar84._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar84._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar84._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar84._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar84._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar84._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar84._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar84._28_4_;
  auVar98[4] = PVar7;
  auVar98._5_3_ = 0;
  auVar98[8] = PVar7;
  auVar98._9_3_ = 0;
  auVar98[0xc] = PVar7;
  auVar98._13_3_ = 0;
  auVar98[0x10] = PVar7;
  auVar98._17_3_ = 0;
  auVar98[0x14] = PVar7;
  auVar98._21_3_ = 0;
  auVar98[0x18] = PVar7;
  auVar98._25_3_ = 0;
  auVar98[0x1c] = PVar7;
  auVar98._29_3_ = 0;
  auVar14 = vpcmpgtd_avx2(auVar98,_DAT_0205a920);
  auVar84 = vcmpps_avx(local_1d8,auVar24,2);
  auVar84 = vandps_avx(auVar84,auVar14);
  uVar65 = vmovmskps_avx(auVar84);
  if (uVar65 == 0) {
    return;
  }
  uVar65 = uVar65 & 0xff;
  auVar84._16_16_ = mm_lookupmask_ps._240_16_;
  auVar84._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a8 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,0x80);
  local_540 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_018b4005:
  lVar70 = 0;
  uVar74 = (ulong)uVar65;
  for (uVar68 = uVar74; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar70 = lVar70 + 1;
  }
  uVar65 = *(uint *)(prim + 2);
  uVar8 = *(uint *)(prim + lVar70 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar65].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar8);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var12 + uVar68 * (long)pvVar11);
  auVar13 = *(undefined1 (*) [16])(_Var12 + (uVar68 + 1) * (long)pvVar11);
  auVar83 = *(undefined1 (*) [16])(_Var12 + (uVar68 + 2) * (long)pvVar11);
  pfVar1 = (float *)(_Var12 + (long)pvVar11 * (uVar68 + 3));
  fVar75 = *pfVar1;
  fVar144 = pfVar1[1];
  fVar157 = pfVar1[2];
  fVar158 = pfVar1[3];
  lVar70 = *(long *)&pGVar9[1].time_range.upper;
  auVar110 = *(undefined1 (*) [16])(lVar70 + (long)p_Var10 * uVar68);
  auVar3 = *(undefined1 (*) [16])(lVar70 + (long)p_Var10 * (uVar68 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar70 + (long)p_Var10 * (uVar68 + 2));
  uVar74 = uVar74 - 1 & uVar74;
  pfVar1 = (float *)(lVar70 + (long)p_Var10 * (uVar68 + 3));
  fVar163 = *pfVar1;
  fVar182 = pfVar1[1];
  fVar184 = pfVar1[2];
  fVar186 = pfVar1[3];
  if (uVar74 != 0) {
    uVar73 = uVar74 - 1 & uVar74;
    for (uVar68 = uVar74; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    }
    if (uVar73 != 0) {
      for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar289._8_4_ = 0x80000000;
  auVar289._0_8_ = 0x8000000080000000;
  auVar289._12_4_ = 0x80000000;
  auVar118._0_4_ = fVar163 * -0.0;
  auVar118._4_4_ = fVar182 * -0.0;
  auVar118._8_4_ = fVar184 * -0.0;
  auVar118._12_4_ = fVar186 * -0.0;
  auVar221 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar118);
  auVar79._0_4_ = auVar3._0_4_ + auVar221._0_4_;
  auVar79._4_4_ = auVar3._4_4_ + auVar221._4_4_;
  auVar79._8_4_ = auVar3._8_4_ + auVar221._8_4_;
  auVar79._12_4_ = auVar3._12_4_ + auVar221._12_4_;
  auVar292 = vfmadd231ps_fma(auVar79,auVar110,auVar289);
  auVar86._12_4_ = 0;
  auVar86._0_12_ = ZEXT812(0);
  auVar86 = auVar86 << 0x20;
  auVar104._0_4_ = fVar163 * 0.0;
  auVar104._4_4_ = fVar182 * 0.0;
  auVar104._8_4_ = fVar184 * 0.0;
  auVar104._12_4_ = fVar186 * 0.0;
  auVar206._8_4_ = 0x3f000000;
  auVar206._0_8_ = 0x3f0000003f000000;
  auVar206._12_4_ = 0x3f000000;
  auVar221 = vfmadd231ps_fma(auVar104,auVar4,auVar206);
  auVar221 = vfmadd231ps_fma(auVar221,auVar3,auVar86);
  auVar134 = vfnmadd231ps_fma(auVar221,auVar110,auVar206);
  auVar278._0_4_ = fVar75 * -0.0;
  auVar278._4_4_ = fVar144 * -0.0;
  auVar278._8_4_ = fVar157 * -0.0;
  auVar278._12_4_ = fVar158 * -0.0;
  auVar221 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar83,auVar278);
  auVar267._0_4_ = auVar13._0_4_ + auVar221._0_4_;
  auVar267._4_4_ = auVar13._4_4_ + auVar221._4_4_;
  auVar267._8_4_ = auVar13._8_4_ + auVar221._8_4_;
  auVar267._12_4_ = auVar13._12_4_ + auVar221._12_4_;
  auVar221 = vfmadd231ps_fma(auVar267,auVar5,auVar289);
  auVar253._0_4_ = fVar75 * 0.0;
  auVar253._4_4_ = fVar144 * 0.0;
  auVar253._8_4_ = fVar157 * 0.0;
  auVar253._12_4_ = fVar158 * 0.0;
  auVar78 = vfmadd231ps_fma(auVar253,auVar83,auVar206);
  auVar78 = vfmadd231ps_fma(auVar78,auVar13,auVar86);
  auVar22 = vfnmadd231ps_fma(auVar78,auVar5,auVar206);
  auVar119._0_4_ = auVar4._0_4_ + auVar118._0_4_;
  auVar119._4_4_ = auVar4._4_4_ + auVar118._4_4_;
  auVar119._8_4_ = auVar4._8_4_ + auVar118._8_4_;
  auVar119._12_4_ = auVar4._12_4_ + auVar118._12_4_;
  auVar78 = vfmadd231ps_fma(auVar119,auVar3,auVar86);
  auVar78 = vfmadd231ps_fma(auVar78,auVar110,auVar289);
  auVar129._0_4_ = fVar163 * 0.5;
  auVar129._4_4_ = fVar182 * 0.5;
  auVar129._8_4_ = fVar184 * 0.5;
  auVar129._12_4_ = fVar186 * 0.5;
  auVar4 = vfmadd231ps_fma(auVar129,auVar86,auVar4);
  auVar3 = vfnmadd231ps_fma(auVar4,auVar206,auVar3);
  auVar211 = vfmadd231ps_fma(auVar3,auVar86,auVar110);
  auVar220._0_4_ = auVar278._0_4_ + auVar83._0_4_;
  auVar220._4_4_ = auVar278._4_4_ + auVar83._4_4_;
  auVar220._8_4_ = auVar278._8_4_ + auVar83._8_4_;
  auVar220._12_4_ = auVar278._12_4_ + auVar83._12_4_;
  auVar110 = vfmadd231ps_fma(auVar220,auVar13,auVar86);
  auVar4 = vfmadd231ps_fma(auVar110,auVar5,auVar289);
  auVar231._0_4_ = fVar75 * 0.5;
  auVar231._4_4_ = fVar144 * 0.5;
  auVar231._8_4_ = fVar157 * 0.5;
  auVar231._12_4_ = fVar158 * 0.5;
  auVar83 = vfmadd231ps_fma(auVar231,auVar86,auVar83);
  auVar13 = vfnmadd231ps_fma(auVar83,auVar206,auVar13);
  auVar5 = vfmadd231ps_fma(auVar13,auVar86,auVar5);
  auVar13 = vshufps_avx(auVar134,auVar134,0xc9);
  auVar83 = vshufps_avx(auVar221,auVar221,0xc9);
  fVar159 = auVar134._0_4_;
  auVar165._0_4_ = fVar159 * auVar83._0_4_;
  fVar102 = auVar134._4_4_;
  auVar165._4_4_ = fVar102 * auVar83._4_4_;
  fVar103 = auVar134._8_4_;
  auVar165._8_4_ = fVar103 * auVar83._8_4_;
  fVar77 = auVar134._12_4_;
  auVar165._12_4_ = fVar77 * auVar83._12_4_;
  auVar83 = vfmsub231ps_fma(auVar165,auVar13,auVar221);
  auVar110 = vshufps_avx(auVar83,auVar83,0xc9);
  auVar83 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar166._0_4_ = fVar159 * auVar83._0_4_;
  auVar166._4_4_ = fVar102 * auVar83._4_4_;
  auVar166._8_4_ = fVar103 * auVar83._8_4_;
  auVar166._12_4_ = fVar77 * auVar83._12_4_;
  auVar13 = vfmsub231ps_fma(auVar166,auVar13,auVar22);
  auVar3 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar211,auVar211,0xc9);
  auVar83 = vshufps_avx(auVar4,auVar4,0xc9);
  fVar183 = auVar211._0_4_;
  auVar145._0_4_ = fVar183 * auVar83._0_4_;
  fVar160 = auVar211._4_4_;
  auVar145._4_4_ = fVar160 * auVar83._4_4_;
  fVar161 = auVar211._8_4_;
  auVar145._8_4_ = fVar161 * auVar83._8_4_;
  fVar162 = auVar211._12_4_;
  auVar145._12_4_ = fVar162 * auVar83._12_4_;
  auVar83 = vfmsub231ps_fma(auVar145,auVar13,auVar4);
  auVar4 = vshufps_avx(auVar83,auVar83,0xc9);
  auVar83 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar191._0_4_ = fVar183 * auVar83._0_4_;
  auVar191._4_4_ = fVar160 * auVar83._4_4_;
  auVar191._8_4_ = fVar161 * auVar83._8_4_;
  auVar191._12_4_ = fVar162 * auVar83._12_4_;
  auVar83 = vfmsub231ps_fma(auVar191,auVar13,auVar5);
  auVar13 = vdpps_avx(auVar110,auVar110,0x7f);
  auVar5 = vshufps_avx(auVar83,auVar83,0xc9);
  fVar144 = auVar13._0_4_;
  auVar221 = ZEXT416((uint)fVar144);
  auVar83 = vrsqrtss_avx(auVar221,auVar221);
  fVar75 = auVar83._0_4_;
  auVar83 = vdpps_avx(auVar110,auVar3,0x7f);
  fVar75 = fVar75 * 1.5 + fVar144 * -0.5 * fVar75 * fVar75 * fVar75;
  fVar163 = auVar110._0_4_ * fVar75;
  fVar182 = auVar110._4_4_ * fVar75;
  fVar184 = auVar110._8_4_ * fVar75;
  fVar186 = auVar110._12_4_ * fVar75;
  auVar245._0_4_ = auVar3._0_4_ * fVar144;
  auVar245._4_4_ = auVar3._4_4_ * fVar144;
  auVar245._8_4_ = auVar3._8_4_ * fVar144;
  auVar245._12_4_ = auVar3._12_4_ * fVar144;
  fVar144 = auVar83._0_4_;
  auVar207._0_4_ = auVar110._0_4_ * fVar144;
  auVar207._4_4_ = auVar110._4_4_ * fVar144;
  auVar207._8_4_ = auVar110._8_4_ * fVar144;
  auVar207._12_4_ = auVar110._12_4_ * fVar144;
  auVar110 = vsubps_avx(auVar245,auVar207);
  auVar83 = vrcpss_avx(auVar221,auVar221);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar83,SUB6416(ZEXT464(0x40000000),0));
  fVar157 = auVar83._0_4_ * auVar13._0_4_;
  auVar13 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar158 = auVar13._0_4_;
  auVar221 = ZEXT416((uint)fVar158);
  auVar83 = vrsqrtss_avx(auVar221,auVar221);
  fVar144 = auVar83._0_4_;
  fVar144 = fVar144 * 1.5 + fVar158 * -0.5 * fVar144 * fVar144 * fVar144;
  fVar252 = fVar144 * auVar4._0_4_;
  fVar264 = fVar144 * auVar4._4_4_;
  fVar265 = fVar144 * auVar4._8_4_;
  fVar266 = fVar144 * auVar4._12_4_;
  auVar83 = vdpps_avx(auVar4,auVar5,0x7f);
  auVar192._0_4_ = fVar158 * auVar5._0_4_;
  auVar192._4_4_ = fVar158 * auVar5._4_4_;
  auVar192._8_4_ = fVar158 * auVar5._8_4_;
  auVar192._12_4_ = fVar158 * auVar5._12_4_;
  fVar158 = auVar83._0_4_;
  auVar146._0_4_ = fVar158 * auVar4._0_4_;
  auVar146._4_4_ = fVar158 * auVar4._4_4_;
  auVar146._8_4_ = fVar158 * auVar4._8_4_;
  auVar146._12_4_ = fVar158 * auVar4._12_4_;
  auVar3 = vsubps_avx(auVar192,auVar146);
  auVar83 = vrcpss_avx(auVar221,auVar221);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar83,SUB6416(ZEXT464(0x40000000),0));
  fVar158 = auVar13._0_4_ * auVar83._0_4_;
  auVar13 = vshufps_avx(auVar292,auVar292,0xff);
  auVar222._0_4_ = auVar13._0_4_ * fVar163;
  auVar222._4_4_ = auVar13._4_4_ * fVar182;
  auVar222._8_4_ = auVar13._8_4_ * fVar184;
  auVar222._12_4_ = auVar13._12_4_ * fVar186;
  local_4a8 = vsubps_avx(auVar292,auVar222);
  auVar83 = vshufps_avx(auVar134,auVar134,0xff);
  auVar167._0_4_ = auVar83._0_4_ * fVar163 + fVar75 * auVar110._0_4_ * fVar157 * auVar13._0_4_;
  auVar167._4_4_ = auVar83._4_4_ * fVar182 + fVar75 * auVar110._4_4_ * fVar157 * auVar13._4_4_;
  auVar167._8_4_ = auVar83._8_4_ * fVar184 + fVar75 * auVar110._8_4_ * fVar157 * auVar13._8_4_;
  auVar167._12_4_ = auVar83._12_4_ * fVar186 + fVar75 * auVar110._12_4_ * fVar157 * auVar13._12_4_;
  auVar110 = vsubps_avx(auVar134,auVar167);
  local_4b8._0_4_ = auVar222._0_4_ + auVar292._0_4_;
  local_4b8._4_4_ = auVar222._4_4_ + auVar292._4_4_;
  fStack_4b0 = auVar222._8_4_ + auVar292._8_4_;
  fStack_4ac = auVar222._12_4_ + auVar292._12_4_;
  auVar13 = vshufps_avx(auVar78,auVar78,0xff);
  auVar105._0_4_ = fVar252 * auVar13._0_4_;
  auVar105._4_4_ = fVar264 * auVar13._4_4_;
  auVar105._8_4_ = fVar265 * auVar13._8_4_;
  auVar105._12_4_ = fVar266 * auVar13._12_4_;
  local_4c8 = vsubps_avx(auVar78,auVar105);
  auVar83 = vshufps_avx(auVar211,auVar211,0xff);
  auVar87._0_4_ = fVar252 * auVar83._0_4_ + auVar13._0_4_ * fVar144 * auVar3._0_4_ * fVar158;
  auVar87._4_4_ = fVar264 * auVar83._4_4_ + auVar13._4_4_ * fVar144 * auVar3._4_4_ * fVar158;
  auVar87._8_4_ = fVar265 * auVar83._8_4_ + auVar13._8_4_ * fVar144 * auVar3._8_4_ * fVar158;
  auVar87._12_4_ = fVar266 * auVar83._12_4_ + auVar13._12_4_ * fVar144 * auVar3._12_4_ * fVar158;
  auVar13 = vsubps_avx(auVar211,auVar87);
  fVar163 = auVar78._0_4_ + auVar105._0_4_;
  fVar182 = auVar78._4_4_ + auVar105._4_4_;
  fVar184 = auVar78._8_4_ + auVar105._8_4_;
  fVar186 = auVar78._12_4_ + auVar105._12_4_;
  local_4d8._0_4_ = local_4a8._0_4_ + auVar110._0_4_ * 0.33333334;
  local_4d8._4_4_ = local_4a8._4_4_ + auVar110._4_4_ * 0.33333334;
  local_4d8._8_4_ = local_4a8._8_4_ + auVar110._8_4_ * 0.33333334;
  local_4d8._12_4_ = local_4a8._12_4_ + auVar110._12_4_ * 0.33333334;
  auVar88._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar88._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar88._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar88._12_4_ = auVar13._12_4_ * 0.33333334;
  local_4e8 = vsubps_avx(local_4c8,auVar88);
  local_488 = vsubps_avx(local_4a8,auVar6);
  auVar13 = vshufps_avx(local_488,local_488,0x55);
  auVar83 = vshufps_avx(local_488,local_488,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar75 = pre->ray_space[k].vz.field_0.m128[0];
  fVar144 = pre->ray_space[k].vz.field_0.m128[1];
  fVar157 = pre->ray_space[k].vz.field_0.m128[2];
  fVar158 = pre->ray_space[k].vz.field_0.m128[3];
  auVar89._0_4_ = fVar75 * auVar83._0_4_;
  auVar89._4_4_ = fVar144 * auVar83._4_4_;
  auVar89._8_4_ = fVar157 * auVar83._8_4_;
  auVar89._12_4_ = fVar158 * auVar83._12_4_;
  auVar110 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar2,auVar13);
  local_498 = vsubps_avx(local_4d8,auVar6);
  auVar13 = vshufps_avx(local_498,local_498,0x55);
  auVar83 = vshufps_avx(local_498,local_498,0xaa);
  auVar290._0_4_ = fVar75 * auVar83._0_4_;
  auVar290._4_4_ = fVar144 * auVar83._4_4_;
  auVar290._8_4_ = fVar157 * auVar83._8_4_;
  auVar290._12_4_ = fVar158 * auVar83._12_4_;
  auVar83 = vfmadd231ps_fma(auVar290,(undefined1  [16])aVar2,auVar13);
  local_318 = vsubps_avx(local_4e8,auVar6);
  auVar13 = vshufps_avx(local_318,local_318,0xaa);
  auVar254._0_4_ = fVar75 * auVar13._0_4_;
  auVar254._4_4_ = fVar144 * auVar13._4_4_;
  auVar254._8_4_ = fVar157 * auVar13._8_4_;
  auVar254._12_4_ = fVar158 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_318,local_318,0x55);
  auVar3 = vfmadd231ps_fma(auVar254,(undefined1  [16])aVar2,auVar13);
  local_328 = vsubps_avx(local_4c8,auVar6);
  auVar13 = vshufps_avx(local_328,local_328,0xaa);
  auVar279._0_4_ = fVar75 * auVar13._0_4_;
  auVar279._4_4_ = fVar144 * auVar13._4_4_;
  auVar279._8_4_ = fVar157 * auVar13._8_4_;
  auVar279._12_4_ = fVar158 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_328,local_328,0x55);
  auVar4 = vfmadd231ps_fma(auVar279,(undefined1  [16])aVar2,auVar13);
  local_338 = vsubps_avx(_local_4b8,auVar6);
  auVar13 = vshufps_avx(local_338,local_338,0xaa);
  auVar147._0_4_ = fVar75 * auVar13._0_4_;
  auVar147._4_4_ = fVar144 * auVar13._4_4_;
  auVar147._8_4_ = fVar157 * auVar13._8_4_;
  auVar147._12_4_ = fVar158 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_338,local_338,0x55);
  auVar5 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar13);
  local_4f8._0_4_ = (fVar159 + auVar167._0_4_) * 0.33333334 + (float)local_4b8._0_4_;
  local_4f8._4_4_ = (fVar102 + auVar167._4_4_) * 0.33333334 + (float)local_4b8._4_4_;
  fStack_4f0 = (fVar103 + auVar167._8_4_) * 0.33333334 + fStack_4b0;
  fStack_4ec = (fVar77 + auVar167._12_4_) * 0.33333334 + fStack_4ac;
  local_348 = vsubps_avx(_local_4f8,auVar6);
  auVar13 = vshufps_avx(local_348,local_348,0xaa);
  auVar208._0_4_ = auVar13._0_4_ * fVar75;
  auVar208._4_4_ = auVar13._4_4_ * fVar144;
  auVar208._8_4_ = auVar13._8_4_ * fVar157;
  auVar208._12_4_ = auVar13._12_4_ * fVar158;
  auVar13 = vshufps_avx(local_348,local_348,0x55);
  auVar221 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar2,auVar13);
  auVar223._0_4_ = (fVar183 + auVar87._0_4_) * 0.33333334;
  auVar223._4_4_ = (fVar160 + auVar87._4_4_) * 0.33333334;
  auVar223._8_4_ = (fVar161 + auVar87._8_4_) * 0.33333334;
  auVar223._12_4_ = (fVar162 + auVar87._12_4_) * 0.33333334;
  auVar134._4_4_ = fVar182;
  auVar134._0_4_ = fVar163;
  auVar134._8_4_ = fVar184;
  auVar134._12_4_ = fVar186;
  _local_508 = vsubps_avx(auVar134,auVar223);
  local_358 = vsubps_avx(_local_508,auVar6);
  auVar13 = vshufps_avx(local_358,local_358,0xaa);
  auVar224._0_4_ = auVar13._0_4_ * fVar75;
  auVar224._4_4_ = auVar13._4_4_ * fVar144;
  auVar224._8_4_ = auVar13._8_4_ * fVar157;
  auVar224._12_4_ = auVar13._12_4_ * fVar158;
  auVar13 = vshufps_avx(local_358,local_358,0x55);
  auVar292 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar2,auVar13);
  local_368 = vsubps_avx(auVar134,auVar6);
  auVar13 = vshufps_avx(local_368,local_368,0xaa);
  auVar80._0_4_ = fVar75 * auVar13._0_4_;
  auVar80._4_4_ = fVar144 * auVar13._4_4_;
  auVar80._8_4_ = fVar157 * auVar13._8_4_;
  auVar80._12_4_ = fVar158 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_368,local_368,0x55);
  auVar13 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar2,auVar13);
  auVar168._4_4_ = local_488._0_4_;
  auVar168._0_4_ = local_488._0_4_;
  auVar168._8_4_ = local_488._0_4_;
  auVar168._12_4_ = local_488._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar6 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar2,auVar168);
  auVar169._4_4_ = local_498._0_4_;
  auVar169._0_4_ = local_498._0_4_;
  auVar169._8_4_ = local_498._0_4_;
  auVar169._12_4_ = local_498._0_4_;
  auVar78 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar2,auVar169);
  uVar76 = local_318._0_4_;
  auVar170._4_4_ = uVar76;
  auVar170._0_4_ = uVar76;
  auVar170._8_4_ = uVar76;
  auVar170._12_4_ = uVar76;
  auVar211 = vfmadd231ps_fma(auVar3,(undefined1  [16])aVar2,auVar170);
  uVar76 = local_328._0_4_;
  auVar171._4_4_ = uVar76;
  auVar171._0_4_ = uVar76;
  auVar171._8_4_ = uVar76;
  auVar171._12_4_ = uVar76;
  auVar134 = vfmadd231ps_fma(auVar4,(undefined1  [16])aVar2,auVar171);
  uVar76 = local_338._0_4_;
  auVar172._4_4_ = uVar76;
  auVar172._0_4_ = uVar76;
  auVar172._8_4_ = uVar76;
  auVar172._12_4_ = uVar76;
  auVar22 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar2,auVar172);
  uVar76 = local_348._0_4_;
  auVar173._4_4_ = uVar76;
  auVar173._0_4_ = uVar76;
  auVar173._8_4_ = uVar76;
  auVar173._12_4_ = uVar76;
  auVar221 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar2,auVar173);
  uVar76 = local_358._0_4_;
  auVar174._4_4_ = uVar76;
  auVar174._0_4_ = uVar76;
  auVar174._8_4_ = uVar76;
  auVar174._12_4_ = uVar76;
  auVar292 = vfmadd231ps_fma(auVar292,(undefined1  [16])aVar2,auVar174);
  uVar76 = local_368._0_4_;
  auVar175._4_4_ = uVar76;
  auVar175._0_4_ = uVar76;
  auVar175._8_4_ = uVar76;
  auVar175._12_4_ = uVar76;
  auVar86 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar175);
  auVar3 = vmovlhps_avx(auVar6,auVar22);
  auVar4 = vmovlhps_avx(auVar78,auVar221);
  auVar5 = vmovlhps_avx(auVar211,auVar292);
  _local_478 = vmovlhps_avx(auVar134,auVar86);
  auVar13 = vminps_avx(auVar3,auVar4);
  auVar83 = vminps_avx(auVar5,_local_478);
  auVar110 = vminps_avx(auVar13,auVar83);
  auVar13 = vmaxps_avx(auVar3,auVar4);
  auVar83 = vmaxps_avx(auVar5,_local_478);
  auVar13 = vmaxps_avx(auVar13,auVar83);
  auVar83 = vshufpd_avx(auVar110,auVar110,3);
  auVar110 = vminps_avx(auVar110,auVar83);
  auVar83 = vshufpd_avx(auVar13,auVar13,3);
  auVar83 = vmaxps_avx(auVar13,auVar83);
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar132,auVar110);
  auVar83 = vandps_avx(auVar132,auVar83);
  auVar13 = vmaxps_avx(auVar13,auVar83);
  auVar83 = vmovshdup_avx(auVar13);
  auVar13 = vmaxss_avx(auVar83,auVar13);
  local_198 = auVar13._0_4_ * 9.536743e-07;
  local_3f8._8_8_ = auVar6._0_8_;
  local_3f8._0_8_ = auVar6._0_8_;
  local_408._8_8_ = auVar78._0_8_;
  local_408._0_8_ = auVar78._0_8_;
  local_418._0_8_ = auVar211._0_8_;
  local_418._8_8_ = local_418._0_8_;
  local_428._8_8_ = auVar134._0_8_;
  local_428._0_8_ = auVar134._0_8_;
  local_438 = auVar22._0_8_;
  register0x00001348 = local_438;
  register0x000013c8 = auVar221._0_8_;
  local_448 = auVar221._0_8_;
  register0x00001408 = auVar292._0_8_;
  local_458 = auVar292._0_8_;
  register0x00001448 = auVar86._0_8_;
  local_468 = auVar86._0_8_;
  local_308 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  fStack_1b0 = -local_198;
  local_1b8 = -local_198;
  fStack_1b4 = -local_198;
  fStack_1ac = fStack_1b0;
  fStack_1a8 = fStack_1b0;
  fStack_1a4 = fStack_1b0;
  fStack_1a0 = fStack_1b0;
  fStack_19c = fStack_1b0;
  local_3c8 = uVar65;
  uStack_3c4 = uVar65;
  uStack_3c0 = uVar65;
  uStack_3bc = uVar65;
  local_3d8 = uVar8;
  uStack_3d4 = uVar8;
  uStack_3d0 = uVar8;
  uStack_3cc = uVar8;
  uVar68 = 0;
  fVar75 = *(float *)(ray + k * 4 + 0x30);
  local_2d8 = vsubps_avx(auVar4,auVar3);
  local_2e8 = vsubps_avx(auVar5,auVar4);
  local_2f8 = vsubps_avx(_local_478,auVar5);
  local_388 = vsubps_avx(_local_4b8,local_4a8);
  local_398 = vsubps_avx(_local_4f8,local_4d8);
  local_3a8 = vsubps_avx(_local_508,local_4e8);
  auVar22._4_4_ = fVar182;
  auVar22._0_4_ = fVar163;
  auVar22._8_4_ = fVar184;
  auVar22._12_4_ = fVar186;
  _local_3b8 = vsubps_avx(auVar22,local_4c8);
  local_678 = ZEXT816(0x3f80000000000000);
  local_378 = local_678;
  do {
    auVar13 = vshufps_avx(local_678,local_678,0x50);
    auVar120._8_4_ = 0x3f800000;
    auVar120._0_8_ = &DAT_3f8000003f800000;
    auVar120._12_4_ = 0x3f800000;
    auVar126._16_4_ = 0x3f800000;
    auVar126._0_16_ = auVar120;
    auVar126._20_4_ = 0x3f800000;
    auVar126._24_4_ = 0x3f800000;
    auVar126._28_4_ = 0x3f800000;
    auVar83 = vsubps_avx(auVar120,auVar13);
    fVar144 = auVar13._0_4_;
    auVar81._0_4_ = local_438._0_4_ * fVar144;
    fVar157 = auVar13._4_4_;
    auVar81._4_4_ = local_438._4_4_ * fVar157;
    fVar158 = auVar13._8_4_;
    auVar81._8_4_ = local_438._8_4_ * fVar158;
    fVar159 = auVar13._12_4_;
    auVar81._12_4_ = local_438._12_4_ * fVar159;
    auVar148._0_4_ = local_448._0_4_ * fVar144;
    auVar148._4_4_ = local_448._4_4_ * fVar157;
    auVar148._8_4_ = local_448._8_4_ * fVar158;
    auVar148._12_4_ = local_448._12_4_ * fVar159;
    auVar193._0_4_ = local_458._0_4_ * fVar144;
    auVar193._4_4_ = local_458._4_4_ * fVar157;
    auVar193._8_4_ = local_458._8_4_ * fVar158;
    auVar193._12_4_ = local_458._12_4_ * fVar159;
    auVar280._0_4_ = local_468._0_4_ * fVar144;
    auVar280._4_4_ = local_468._4_4_ * fVar157;
    auVar280._8_4_ = local_468._8_4_ * fVar158;
    auVar280._12_4_ = local_468._12_4_ * fVar159;
    auVar221 = vfmadd231ps_fma(auVar81,auVar83,local_3f8);
    auVar292 = vfmadd231ps_fma(auVar148,auVar83,local_408);
    auVar78 = vfmadd231ps_fma(auVar193,auVar83,local_418);
    auVar211 = vfmadd231ps_fma(auVar280,local_428,auVar83);
    local_638 = auVar211._0_4_;
    auVar13 = vmovshdup_avx(local_378);
    fVar144 = local_378._0_4_;
    fVar102 = (auVar13._0_4_ - fVar144) * 0.04761905;
    auVar219._4_4_ = fVar144;
    auVar219._0_4_ = fVar144;
    auVar219._8_4_ = fVar144;
    auVar219._12_4_ = fVar144;
    auVar219._16_4_ = fVar144;
    auVar219._20_4_ = fVar144;
    auVar219._24_4_ = fVar144;
    auVar219._28_4_ = fVar144;
    auVar115._0_8_ = auVar13._0_8_;
    auVar115._8_8_ = auVar115._0_8_;
    auVar115._16_8_ = auVar115._0_8_;
    auVar115._24_8_ = auVar115._0_8_;
    auVar84 = vsubps_avx(auVar115,auVar219);
    uVar76 = auVar221._0_4_;
    auVar297._4_4_ = uVar76;
    auVar297._0_4_ = uVar76;
    auVar297._8_4_ = uVar76;
    auVar297._12_4_ = uVar76;
    auVar297._16_4_ = uVar76;
    auVar297._20_4_ = uVar76;
    auVar297._24_4_ = uVar76;
    auVar297._28_4_ = uVar76;
    auVar13 = vmovshdup_avx(auVar221);
    uVar164 = auVar13._0_8_;
    auVar276._8_8_ = uVar164;
    auVar276._0_8_ = uVar164;
    auVar276._16_8_ = uVar164;
    auVar276._24_8_ = uVar164;
    fVar103 = auVar292._0_4_;
    auVar99._4_4_ = fVar103;
    auVar99._0_4_ = fVar103;
    auVar99._8_4_ = fVar103;
    auVar99._12_4_ = fVar103;
    auVar99._16_4_ = fVar103;
    auVar99._20_4_ = fVar103;
    auVar99._24_4_ = fVar103;
    auVar99._28_4_ = fVar103;
    auVar83 = vmovshdup_avx(auVar292);
    auVar179._0_8_ = auVar83._0_8_;
    auVar179._8_8_ = auVar179._0_8_;
    auVar179._16_8_ = auVar179._0_8_;
    auVar179._24_8_ = auVar179._0_8_;
    fVar160 = auVar78._0_4_;
    auVar251._4_4_ = fVar160;
    auVar251._0_4_ = fVar160;
    auVar251._8_4_ = fVar160;
    auVar251._12_4_ = fVar160;
    auVar251._16_4_ = fVar160;
    auVar251._20_4_ = fVar160;
    auVar251._24_4_ = fVar160;
    auVar251._28_4_ = fVar160;
    auVar110 = vmovshdup_avx(auVar78);
    auVar230._0_8_ = auVar110._0_8_;
    auVar230._8_8_ = auVar230._0_8_;
    auVar230._16_8_ = auVar230._0_8_;
    auVar230._24_8_ = auVar230._0_8_;
    auVar6 = vmovshdup_avx(auVar211);
    auVar134 = vfmadd132ps_fma(auVar84,auVar219,_DAT_02020f20);
    auVar84 = vsubps_avx(auVar126,ZEXT1632(auVar134));
    fVar144 = auVar134._0_4_;
    auVar286._0_4_ = fVar103 * fVar144;
    fVar157 = auVar134._4_4_;
    auVar286._4_4_ = fVar103 * fVar157;
    fVar158 = auVar134._8_4_;
    auVar286._8_4_ = fVar103 * fVar158;
    fVar159 = auVar134._12_4_;
    auVar286._12_4_ = fVar103 * fVar159;
    auVar286._16_4_ = fVar103 * 0.0;
    auVar286._20_4_ = fVar103 * 0.0;
    auVar286._24_4_ = fVar103 * 0.0;
    auVar286._28_4_ = 0;
    auVar134 = vfmadd231ps_fma(auVar286,auVar84,auVar297);
    fVar77 = auVar83._0_4_;
    auVar260._0_4_ = fVar77 * fVar144;
    fVar183 = auVar83._4_4_;
    auVar260._4_4_ = fVar183 * fVar157;
    auVar260._8_4_ = fVar77 * fVar158;
    auVar260._12_4_ = fVar183 * fVar159;
    auVar260._16_4_ = fVar77 * 0.0;
    auVar260._20_4_ = fVar183 * 0.0;
    auVar260._24_4_ = fVar77 * 0.0;
    auVar260._28_4_ = 0;
    auVar22 = vfmadd231ps_fma(auVar260,auVar84,auVar276);
    auVar14._4_4_ = fVar160 * fVar157;
    auVar14._0_4_ = fVar160 * fVar144;
    auVar14._8_4_ = fVar160 * fVar158;
    auVar14._12_4_ = fVar160 * fVar159;
    auVar14._16_4_ = fVar160 * 0.0;
    auVar14._20_4_ = fVar160 * 0.0;
    auVar14._24_4_ = fVar160 * 0.0;
    auVar14._28_4_ = auVar13._4_4_;
    auVar86 = vfmadd231ps_fma(auVar14,auVar84,auVar99);
    fVar77 = auVar110._0_4_;
    fVar183 = auVar110._4_4_;
    auVar25._4_4_ = fVar183 * fVar157;
    auVar25._0_4_ = fVar77 * fVar144;
    auVar25._8_4_ = fVar77 * fVar158;
    auVar25._12_4_ = fVar183 * fVar159;
    auVar25._16_4_ = fVar77 * 0.0;
    auVar25._20_4_ = fVar183 * 0.0;
    auVar25._24_4_ = fVar77 * 0.0;
    auVar25._28_4_ = uVar76;
    auVar132 = vfmadd231ps_fma(auVar25,auVar84,auVar179);
    auVar13 = vshufps_avx(auVar221,auVar221,0xaa);
    auVar180._0_8_ = auVar13._0_8_;
    auVar180._8_8_ = auVar180._0_8_;
    auVar180._16_8_ = auVar180._0_8_;
    auVar180._24_8_ = auVar180._0_8_;
    auVar83 = vshufps_avx(auVar221,auVar221,0xff);
    uStack_5e0 = auVar83._0_8_;
    local_5e8 = (undefined1  [8])uStack_5e0;
    uStack_5d8 = uStack_5e0;
    uStack_5d0 = uStack_5e0;
    auVar26._4_4_ = fVar157 * local_638;
    auVar26._0_4_ = fVar144 * local_638;
    auVar26._8_4_ = fVar158 * local_638;
    auVar26._12_4_ = fVar159 * local_638;
    auVar26._16_4_ = local_638 * 0.0;
    auVar26._20_4_ = local_638 * 0.0;
    auVar26._24_4_ = local_638 * 0.0;
    auVar26._28_4_ = 0x3f800000;
    auVar79 = vfmadd231ps_fma(auVar26,auVar84,auVar251);
    auVar110 = vshufps_avx(auVar292,auVar292,0xaa);
    auVar142._0_8_ = auVar110._0_8_;
    auVar142._8_8_ = auVar142._0_8_;
    auVar142._16_8_ = auVar142._0_8_;
    auVar142._24_8_ = auVar142._0_8_;
    auVar221 = vshufps_avx(auVar292,auVar292,0xff);
    auVar156._0_8_ = auVar221._0_8_;
    auVar156._8_8_ = auVar156._0_8_;
    auVar156._16_8_ = auVar156._0_8_;
    auVar156._24_8_ = auVar156._0_8_;
    fVar77 = auVar6._0_4_;
    fVar183 = auVar6._4_4_;
    auVar27._4_4_ = fVar183 * fVar157;
    auVar27._0_4_ = fVar77 * fVar144;
    auVar27._8_4_ = fVar77 * fVar158;
    auVar27._12_4_ = fVar183 * fVar159;
    auVar27._16_4_ = fVar77 * 0.0;
    auVar27._20_4_ = fVar183 * 0.0;
    auVar27._24_4_ = fVar77 * 0.0;
    auVar27._28_4_ = fVar160;
    auVar80 = vfmadd231ps_fma(auVar27,auVar84,auVar230);
    auVar28._28_4_ = fVar103;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar86._12_4_ * fVar159,
                            CONCAT48(auVar86._8_4_ * fVar158,
                                     CONCAT44(auVar86._4_4_ * fVar157,auVar86._0_4_ * fVar144))));
    auVar134 = vfmadd231ps_fma(auVar28,auVar84,ZEXT1632(auVar134));
    auVar29._28_4_ = auVar83._4_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar132._12_4_ * fVar159,
                            CONCAT48(auVar132._8_4_ * fVar158,
                                     CONCAT44(auVar132._4_4_ * fVar157,auVar132._0_4_ * fVar144))));
    auVar22 = vfmadd231ps_fma(auVar29,auVar84,ZEXT1632(auVar22));
    auVar83 = vshufps_avx(auVar78,auVar78,0xaa);
    uVar164 = auVar83._0_8_;
    auVar261._8_8_ = uVar164;
    auVar261._0_8_ = uVar164;
    auVar261._16_8_ = uVar164;
    auVar261._24_8_ = uVar164;
    auVar6 = vshufps_avx(auVar78,auVar78,0xff);
    uVar164 = auVar6._0_8_;
    auVar287._8_8_ = uVar164;
    auVar287._0_8_ = uVar164;
    auVar287._16_8_ = uVar164;
    auVar287._24_8_ = uVar164;
    auVar86 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar79._12_4_,
                                                 CONCAT48(fVar158 * auVar79._8_4_,
                                                          CONCAT44(fVar157 * auVar79._4_4_,
                                                                   fVar144 * auVar79._0_4_)))),
                              auVar84,ZEXT1632(auVar86));
    auVar292 = vshufps_avx(auVar211,auVar211,0xaa);
    auVar78 = vshufps_avx(auVar211,auVar211,0xff);
    local_638 = auVar78._0_4_;
    fStack_634 = auVar78._4_4_;
    auVar30._28_4_ = fStack_634;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar80._12_4_ * fVar159,
                            CONCAT48(auVar80._8_4_ * fVar158,
                                     CONCAT44(auVar80._4_4_ * fVar157,auVar80._0_4_ * fVar144))));
    auVar78 = vfmadd231ps_fma(auVar30,auVar84,ZEXT1632(auVar132));
    auVar211 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar86._12_4_,
                                                  CONCAT48(fVar158 * auVar86._8_4_,
                                                           CONCAT44(fVar157 * auVar86._4_4_,
                                                                    fVar144 * auVar86._0_4_)))),
                               auVar84,ZEXT1632(auVar134));
    auVar14 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar134));
    auVar134 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar78._12_4_,
                                                  CONCAT48(fVar158 * auVar78._8_4_,
                                                           CONCAT44(fVar157 * auVar78._4_4_,
                                                                    fVar144 * auVar78._0_4_)))),
                               auVar84,ZEXT1632(auVar22));
    auVar15 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar22));
    fVar252 = fVar102 * auVar14._0_4_ * 3.0;
    fVar265 = fVar102 * auVar14._4_4_ * 3.0;
    auVar31._4_4_ = fVar265;
    auVar31._0_4_ = fVar252;
    fVar240 = fVar102 * auVar14._8_4_ * 3.0;
    auVar31._8_4_ = fVar240;
    fVar241 = fVar102 * auVar14._12_4_ * 3.0;
    auVar31._12_4_ = fVar241;
    fVar242 = fVar102 * auVar14._16_4_ * 3.0;
    auVar31._16_4_ = fVar242;
    fVar243 = fVar102 * auVar14._20_4_ * 3.0;
    auVar31._20_4_ = fVar243;
    fVar244 = fVar102 * auVar14._24_4_ * 3.0;
    auVar31._24_4_ = fVar244;
    auVar31._28_4_ = 0x40400000;
    local_5b8._0_4_ = fVar102 * auVar15._0_4_ * 3.0;
    local_5b8._4_4_ = fVar102 * auVar15._4_4_ * 3.0;
    fStack_5b0 = fVar102 * auVar15._8_4_ * 3.0;
    fStack_5ac = fVar102 * auVar15._12_4_ * 3.0;
    fStack_5a8 = fVar102 * auVar15._16_4_ * 3.0;
    fStack_5a4 = fVar102 * auVar15._20_4_ * 3.0;
    fStack_5a0 = fVar102 * auVar15._24_4_ * 3.0;
    fStack_59c = auVar15._28_4_;
    fVar103 = auVar110._0_4_;
    fVar77 = auVar110._4_4_;
    auVar32._4_4_ = fVar77 * fVar157;
    auVar32._0_4_ = fVar103 * fVar144;
    auVar32._8_4_ = fVar103 * fVar158;
    auVar32._12_4_ = fVar77 * fVar159;
    auVar32._16_4_ = fVar103 * 0.0;
    auVar32._20_4_ = fVar77 * 0.0;
    auVar32._24_4_ = fVar103 * 0.0;
    auVar32._28_4_ = auVar14._28_4_;
    auVar110 = vfmadd231ps_fma(auVar32,auVar84,auVar180);
    fVar103 = auVar221._0_4_;
    fVar183 = auVar221._4_4_;
    auVar33._4_4_ = fVar183 * fVar157;
    auVar33._0_4_ = fVar103 * fVar144;
    auVar33._8_4_ = fVar103 * fVar158;
    auVar33._12_4_ = fVar183 * fVar159;
    auVar33._16_4_ = fVar103 * 0.0;
    auVar33._20_4_ = fVar183 * 0.0;
    auVar33._24_4_ = fVar103 * 0.0;
    auVar33._28_4_ = auVar13._4_4_;
    auVar13 = vfmadd231ps_fma(auVar33,auVar84,_local_5e8);
    fVar103 = auVar83._0_4_;
    fVar183 = auVar83._4_4_;
    auVar34._4_4_ = fVar183 * fVar157;
    auVar34._0_4_ = fVar103 * fVar144;
    auVar34._8_4_ = fVar103 * fVar158;
    auVar34._12_4_ = fVar183 * fVar159;
    auVar34._16_4_ = fVar103 * 0.0;
    auVar34._20_4_ = fVar183 * 0.0;
    auVar34._24_4_ = fVar103 * 0.0;
    auVar34._28_4_ = fVar102;
    auVar83 = vfmadd231ps_fma(auVar34,auVar84,auVar142);
    fVar103 = auVar6._0_4_;
    fVar160 = auVar6._4_4_;
    auVar35._4_4_ = fVar160 * fVar157;
    auVar35._0_4_ = fVar103 * fVar144;
    auVar35._8_4_ = fVar103 * fVar158;
    auVar35._12_4_ = fVar160 * fVar159;
    auVar35._16_4_ = fVar103 * 0.0;
    auVar35._20_4_ = fVar160 * 0.0;
    auVar35._24_4_ = fVar103 * 0.0;
    auVar35._28_4_ = fVar77;
    auVar6 = vfmadd231ps_fma(auVar35,auVar84,auVar156);
    local_2c8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar211));
    fVar103 = auVar292._0_4_;
    fVar77 = auVar292._4_4_;
    auVar36._4_4_ = fVar77 * fVar157;
    auVar36._0_4_ = fVar103 * fVar144;
    auVar36._8_4_ = fVar103 * fVar158;
    auVar36._12_4_ = fVar77 * fVar159;
    auVar36._16_4_ = fVar103 * 0.0;
    auVar36._20_4_ = fVar77 * 0.0;
    auVar36._24_4_ = fVar103 * 0.0;
    auVar36._28_4_ = local_2c8._28_4_;
    auVar221 = vfmadd231ps_fma(auVar36,auVar84,auVar261);
    auVar18 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar134));
    auVar37._4_4_ = fVar157 * fStack_634;
    auVar37._0_4_ = fVar144 * local_638;
    auVar37._8_4_ = fVar158 * local_638;
    auVar37._12_4_ = fVar159 * fStack_634;
    auVar37._16_4_ = local_638 * 0.0;
    auVar37._20_4_ = fStack_634 * 0.0;
    auVar37._24_4_ = local_638 * 0.0;
    auVar37._28_4_ = fVar183;
    auVar292 = vfmadd231ps_fma(auVar37,auVar84,auVar287);
    auVar38._28_4_ = fVar77;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(fVar159 * auVar83._12_4_,
                            CONCAT48(fVar158 * auVar83._8_4_,
                                     CONCAT44(fVar157 * auVar83._4_4_,fVar144 * auVar83._0_4_))));
    auVar110 = vfmadd231ps_fma(auVar38,auVar84,ZEXT1632(auVar110));
    auVar13 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar6._12_4_,
                                                 CONCAT48(fVar158 * auVar6._8_4_,
                                                          CONCAT44(fVar157 * auVar6._4_4_,
                                                                   fVar144 * auVar6._0_4_)))),
                              auVar84,ZEXT1632(auVar13));
    fVar252 = auVar211._0_4_ + fVar252;
    fVar265 = auVar211._4_4_ + fVar265;
    fVar240 = auVar211._8_4_ + fVar240;
    fVar241 = auVar211._12_4_ + fVar241;
    fVar242 = fVar242 + 0.0;
    fVar243 = fVar243 + 0.0;
    fVar244 = fVar244 + 0.0;
    auVar39._28_4_ = 0x40400000;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(auVar292._12_4_ * fVar159,
                            CONCAT48(auVar292._8_4_ * fVar158,
                                     CONCAT44(auVar292._4_4_ * fVar157,auVar292._0_4_ * fVar144))));
    auVar83 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar221._12_4_,
                                                 CONCAT48(fVar158 * auVar221._8_4_,
                                                          CONCAT44(fVar157 * auVar221._4_4_,
                                                                   fVar144 * auVar221._0_4_)))),
                              auVar84,ZEXT1632(auVar83));
    auVar6 = vfmadd231ps_fma(auVar39,auVar84,ZEXT1632(auVar6));
    auVar221 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar83._12_4_,
                                                  CONCAT48(fVar158 * auVar83._8_4_,
                                                           CONCAT44(fVar157 * auVar83._4_4_,
                                                                    fVar144 * auVar83._0_4_)))),
                               auVar84,ZEXT1632(auVar110));
    auVar292 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar6._12_4_,
                                                  CONCAT48(fVar158 * auVar6._8_4_,
                                                           CONCAT44(fVar157 * auVar6._4_4_,
                                                                    fVar144 * auVar6._0_4_)))),
                               ZEXT1632(auVar13),auVar84);
    auVar84 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar110));
    auVar14 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar13));
    fVar144 = fVar102 * auVar84._0_4_ * 3.0;
    fVar157 = fVar102 * auVar84._4_4_ * 3.0;
    auVar40._4_4_ = fVar157;
    auVar40._0_4_ = fVar144;
    fVar158 = fVar102 * auVar84._8_4_ * 3.0;
    auVar40._8_4_ = fVar158;
    fVar159 = fVar102 * auVar84._12_4_ * 3.0;
    auVar40._12_4_ = fVar159;
    fVar160 = fVar102 * auVar84._16_4_ * 3.0;
    auVar40._16_4_ = fVar160;
    fVar161 = fVar102 * auVar84._20_4_ * 3.0;
    auVar40._20_4_ = fVar161;
    fVar162 = fVar102 * auVar84._24_4_ * 3.0;
    auVar40._24_4_ = fVar162;
    auVar40._28_4_ = 0x40400000;
    auVar205._0_4_ = fVar102 * auVar14._0_4_ * 3.0;
    auVar205._4_4_ = fVar102 * auVar14._4_4_ * 3.0;
    auVar205._8_4_ = fVar102 * auVar14._8_4_ * 3.0;
    auVar205._12_4_ = fVar102 * auVar14._12_4_ * 3.0;
    auVar205._16_4_ = fVar102 * auVar14._16_4_ * 3.0;
    auVar205._20_4_ = fVar102 * auVar14._20_4_ * 3.0;
    auVar205._24_4_ = fVar102 * auVar14._24_4_ * 3.0;
    auVar205._28_4_ = 0;
    auVar19 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar221));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar292));
    auVar84 = vsubps_avx(ZEXT1632(auVar221),ZEXT1632(auVar211));
    auVar14 = vsubps_avx(ZEXT1632(auVar292),ZEXT1632(auVar134));
    auVar16 = vsubps_avx(auVar19,local_2c8);
    fVar264 = auVar84._0_4_ + auVar16._0_4_;
    fVar266 = auVar84._4_4_ + auVar16._4_4_;
    fVar185 = auVar84._8_4_ + auVar16._8_4_;
    fVar187 = auVar84._12_4_ + auVar16._12_4_;
    fVar188 = auVar84._16_4_ + auVar16._16_4_;
    fVar189 = auVar84._20_4_ + auVar16._20_4_;
    fVar190 = auVar84._24_4_ + auVar16._24_4_;
    auVar17 = vsubps_avx(local_78,auVar18);
    auVar277._0_4_ = auVar14._0_4_ + auVar17._0_4_;
    auVar277._4_4_ = auVar14._4_4_ + auVar17._4_4_;
    auVar277._8_4_ = auVar14._8_4_ + auVar17._8_4_;
    auVar277._12_4_ = auVar14._12_4_ + auVar17._12_4_;
    auVar277._16_4_ = auVar14._16_4_ + auVar17._16_4_;
    auVar277._20_4_ = auVar14._20_4_ + auVar17._20_4_;
    auVar277._24_4_ = auVar14._24_4_ + auVar17._24_4_;
    auVar277._28_4_ = auVar14._28_4_ + auVar17._28_4_;
    fVar102 = auVar134._0_4_;
    local_158 = fVar102 + (float)local_5b8._0_4_;
    fVar103 = auVar134._4_4_;
    fStack_154 = fVar103 + (float)local_5b8._4_4_;
    fVar77 = auVar134._8_4_;
    fStack_150 = fVar77 + fStack_5b0;
    fVar183 = auVar134._12_4_;
    fStack_14c = fVar183 + fStack_5ac;
    fStack_148 = fStack_5a8 + 0.0;
    fStack_144 = fStack_5a4 + 0.0;
    fStack_140 = fStack_5a0 + 0.0;
    fStack_13c = auVar15._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar211);
    auVar14 = vsubps_avx(local_98,auVar31);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_b8 = ZEXT1632(auVar134);
    auVar14 = vsubps_avx(local_b8,_local_5b8);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_f8._0_4_ = auVar221._0_4_ + fVar144;
    local_f8._4_4_ = auVar221._4_4_ + fVar157;
    local_f8._8_4_ = auVar221._8_4_ + fVar158;
    local_f8._12_4_ = auVar221._12_4_ + fVar159;
    local_f8._16_4_ = fVar160 + 0.0;
    local_f8._20_4_ = fVar161 + 0.0;
    local_f8._24_4_ = fVar162 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar262 = ZEXT1632(auVar221);
    auVar14 = vsubps_avx(auVar262,auVar40);
    auVar20 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    fVar144 = auVar292._0_4_;
    local_138._0_4_ = fVar144 + auVar205._0_4_;
    fVar157 = auVar292._4_4_;
    local_138._4_4_ = fVar157 + auVar205._4_4_;
    fVar158 = auVar292._8_4_;
    local_138._8_4_ = fVar158 + auVar205._8_4_;
    fVar159 = auVar292._12_4_;
    local_138._12_4_ = fVar159 + auVar205._12_4_;
    local_138._16_4_ = auVar205._16_4_ + 0.0;
    local_138._20_4_ = auVar205._20_4_ + 0.0;
    local_138._24_4_ = auVar205._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar14 = vsubps_avx(ZEXT1632(auVar292),auVar205);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    auVar41._4_4_ = fVar103 * fVar266;
    auVar41._0_4_ = fVar102 * fVar264;
    auVar41._8_4_ = fVar77 * fVar185;
    auVar41._12_4_ = fVar183 * fVar187;
    auVar41._16_4_ = fVar188 * 0.0;
    auVar41._20_4_ = fVar189 * 0.0;
    auVar41._24_4_ = fVar190 * 0.0;
    auVar41._28_4_ = auVar14._28_4_;
    auVar13 = vfnmadd231ps_fma(auVar41,local_98,auVar277);
    auVar42._4_4_ = fStack_154 * fVar266;
    auVar42._0_4_ = local_158 * fVar264;
    auVar42._8_4_ = fStack_150 * fVar185;
    auVar42._12_4_ = fStack_14c * fVar187;
    auVar42._16_4_ = fStack_148 * fVar188;
    auVar42._20_4_ = fStack_144 * fVar189;
    auVar42._24_4_ = fStack_140 * fVar190;
    auVar42._28_4_ = auVar20._28_4_;
    auVar58._4_4_ = fVar265;
    auVar58._0_4_ = fVar252;
    auVar58._8_4_ = fVar240;
    auVar58._12_4_ = fVar241;
    auVar58._16_4_ = fVar242;
    auVar58._20_4_ = fVar243;
    auVar58._24_4_ = fVar244;
    auVar58._28_4_ = 0x40400000;
    auVar83 = vfnmadd231ps_fma(auVar42,auVar277,auVar58);
    auVar43._4_4_ = local_178._4_4_ * fVar266;
    auVar43._0_4_ = local_178._0_4_ * fVar264;
    auVar43._8_4_ = local_178._8_4_ * fVar185;
    auVar43._12_4_ = local_178._12_4_ * fVar187;
    auVar43._16_4_ = local_178._16_4_ * fVar188;
    auVar43._20_4_ = local_178._20_4_ * fVar189;
    auVar43._24_4_ = local_178._24_4_ * fVar190;
    auVar43._28_4_ = fStack_13c;
    auVar110 = vfnmadd231ps_fma(auVar43,local_d8,auVar277);
    local_5e8._0_4_ = auVar18._0_4_;
    local_5e8._4_4_ = auVar18._4_4_;
    uStack_5e0._0_4_ = auVar18._8_4_;
    uStack_5e0._4_4_ = auVar18._12_4_;
    uStack_5d8._0_4_ = auVar18._16_4_;
    uStack_5d8._4_4_ = auVar18._20_4_;
    uStack_5d0._0_4_ = auVar18._24_4_;
    auVar44._4_4_ = fVar266 * (float)local_5e8._4_4_;
    auVar44._0_4_ = fVar264 * (float)local_5e8._0_4_;
    auVar44._8_4_ = fVar185 * (float)uStack_5e0;
    auVar44._12_4_ = fVar187 * uStack_5e0._4_4_;
    auVar44._16_4_ = fVar188 * (float)uStack_5d8;
    auVar44._20_4_ = fVar189 * uStack_5d8._4_4_;
    auVar44._24_4_ = fVar190 * (float)uStack_5d0;
    auVar44._28_4_ = local_178._28_4_;
    auVar6 = vfnmadd231ps_fma(auVar44,local_2c8,auVar277);
    auVar64._4_4_ = fVar157 * fVar266;
    auVar64._0_4_ = fVar144 * fVar264;
    auVar64._8_4_ = fVar158 * fVar185;
    auVar64._12_4_ = fVar159 * fVar187;
    auVar64._16_4_ = fVar188 * 0.0;
    auVar64._20_4_ = fVar189 * 0.0;
    auVar64._24_4_ = fVar190 * 0.0;
    auVar64._28_4_ = DAT_0205d4a0._28_4_;
    auVar221 = vfnmadd231ps_fma(auVar64,auVar262,auVar277);
    auVar45._4_4_ = local_138._4_4_ * fVar266;
    auVar45._0_4_ = local_138._0_4_ * fVar264;
    auVar45._8_4_ = local_138._8_4_ * fVar185;
    auVar45._12_4_ = local_138._12_4_ * fVar187;
    auVar45._16_4_ = local_138._16_4_ * fVar188;
    auVar45._20_4_ = local_138._20_4_ * fVar189;
    auVar45._24_4_ = local_138._24_4_ * fVar190;
    auVar45._28_4_ = local_2c8._28_4_;
    auVar78 = vfnmadd231ps_fma(auVar45,local_f8,auVar277);
    auVar46._4_4_ = local_118._4_4_ * fVar266;
    auVar46._0_4_ = local_118._0_4_ * fVar264;
    auVar46._8_4_ = local_118._8_4_ * fVar185;
    auVar46._12_4_ = local_118._12_4_ * fVar187;
    auVar46._16_4_ = local_118._16_4_ * fVar188;
    auVar46._20_4_ = local_118._20_4_ * fVar189;
    auVar46._24_4_ = local_118._24_4_ * fVar190;
    auVar46._28_4_ = local_d8._28_4_;
    auVar211 = vfnmadd231ps_fma(auVar46,auVar277,auVar20);
    auVar47._4_4_ = local_78._4_4_ * fVar266;
    auVar47._0_4_ = local_78._0_4_ * fVar264;
    auVar47._8_4_ = local_78._8_4_ * fVar185;
    auVar47._12_4_ = local_78._12_4_ * fVar187;
    auVar47._16_4_ = local_78._16_4_ * fVar188;
    auVar47._20_4_ = local_78._20_4_ * fVar189;
    auVar47._24_4_ = local_78._24_4_ * fVar190;
    auVar47._28_4_ = auVar84._28_4_ + auVar16._28_4_;
    auVar134 = vfnmadd231ps_fma(auVar47,auVar277,auVar19);
    auVar14 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar83));
    auVar84 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar83));
    auVar15 = vminps_avx(ZEXT1632(auVar110),ZEXT1632(auVar6));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar110),ZEXT1632(auVar6));
    auVar84 = vmaxps_avx(auVar84,auVar14);
    auVar16 = vminps_avx(ZEXT1632(auVar221),ZEXT1632(auVar78));
    auVar14 = vmaxps_avx(ZEXT1632(auVar221),ZEXT1632(auVar78));
    auVar17 = vminps_avx(ZEXT1632(auVar211),ZEXT1632(auVar134));
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar211),ZEXT1632(auVar134));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar84,auVar14);
    auVar63._4_4_ = fStack_194;
    auVar63._0_4_ = local_198;
    auVar63._8_4_ = fStack_190;
    auVar63._12_4_ = fStack_18c;
    auVar63._16_4_ = fStack_188;
    auVar63._20_4_ = fStack_184;
    auVar63._24_4_ = fStack_180;
    auVar63._28_4_ = fStack_17c;
    auVar84 = vcmpps_avx(auVar16,auVar63,2);
    auVar62._4_4_ = fStack_1b4;
    auVar62._0_4_ = local_1b8;
    auVar62._8_4_ = fStack_1b0;
    auVar62._12_4_ = fStack_1ac;
    auVar62._16_4_ = fStack_1a8;
    auVar62._20_4_ = fStack_1a4;
    auVar62._24_4_ = fStack_1a0;
    auVar62._28_4_ = fStack_19c;
    auVar14 = vcmpps_avx(auVar14,auVar62,5);
    auVar84 = vandps_avx(auVar14,auVar84);
    auVar14 = local_2a8 & auVar84;
    uVar66 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(local_2c8,local_98);
      auVar15 = vsubps_avx(auVar19,auVar262);
      fVar161 = auVar14._0_4_ + auVar15._0_4_;
      fVar162 = auVar14._4_4_ + auVar15._4_4_;
      fVar264 = auVar14._8_4_ + auVar15._8_4_;
      fVar266 = auVar14._12_4_ + auVar15._12_4_;
      fVar185 = auVar14._16_4_ + auVar15._16_4_;
      fVar187 = auVar14._20_4_ + auVar15._20_4_;
      fVar188 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(auVar18,local_b8);
      auVar17 = vsubps_avx(local_78,ZEXT1632(auVar292));
      auVar100._0_4_ = auVar16._0_4_ + auVar17._0_4_;
      auVar100._4_4_ = auVar16._4_4_ + auVar17._4_4_;
      auVar100._8_4_ = auVar16._8_4_ + auVar17._8_4_;
      auVar100._12_4_ = auVar16._12_4_ + auVar17._12_4_;
      auVar100._16_4_ = auVar16._16_4_ + auVar17._16_4_;
      auVar100._20_4_ = auVar16._20_4_ + auVar17._20_4_;
      auVar100._24_4_ = auVar16._24_4_ + auVar17._24_4_;
      fVar160 = auVar17._28_4_;
      auVar100._28_4_ = auVar16._28_4_ + fVar160;
      auVar288._0_4_ = fVar102 * fVar161;
      auVar288._4_4_ = fVar103 * fVar162;
      auVar288._8_4_ = fVar77 * fVar264;
      auVar288._12_4_ = fVar183 * fVar266;
      auVar288._16_4_ = fVar185 * 0.0;
      auVar288._20_4_ = fVar187 * 0.0;
      auVar288._24_4_ = fVar188 * 0.0;
      auVar288._28_4_ = 0;
      auVar221 = vfnmadd231ps_fma(auVar288,auVar100,local_98);
      auVar48._4_4_ = fVar162 * fStack_154;
      auVar48._0_4_ = fVar161 * local_158;
      auVar48._8_4_ = fVar264 * fStack_150;
      auVar48._12_4_ = fVar266 * fStack_14c;
      auVar48._16_4_ = fVar185 * fStack_148;
      auVar48._20_4_ = fVar187 * fStack_144;
      auVar48._24_4_ = fVar188 * fStack_140;
      auVar48._28_4_ = fVar160;
      auVar59._4_4_ = fVar265;
      auVar59._0_4_ = fVar252;
      auVar59._8_4_ = fVar240;
      auVar59._12_4_ = fVar241;
      auVar59._16_4_ = fVar242;
      auVar59._20_4_ = fVar243;
      auVar59._24_4_ = fVar244;
      auVar59._28_4_ = 0x40400000;
      auVar13 = vfnmadd213ps_fma(auVar59,auVar100,auVar48);
      auVar49._4_4_ = fVar162 * local_178._4_4_;
      auVar49._0_4_ = fVar161 * local_178._0_4_;
      auVar49._8_4_ = fVar264 * local_178._8_4_;
      auVar49._12_4_ = fVar266 * local_178._12_4_;
      auVar49._16_4_ = fVar185 * local_178._16_4_;
      auVar49._20_4_ = fVar187 * local_178._20_4_;
      auVar49._24_4_ = fVar188 * local_178._24_4_;
      auVar49._28_4_ = fVar160;
      auVar83 = vfnmadd213ps_fma(local_d8,auVar100,auVar49);
      auVar50._4_4_ = (float)local_5e8._4_4_ * fVar162;
      auVar50._0_4_ = (float)local_5e8._0_4_ * fVar161;
      auVar50._8_4_ = (float)uStack_5e0 * fVar264;
      auVar50._12_4_ = uStack_5e0._4_4_ * fVar266;
      auVar50._16_4_ = (float)uStack_5d8 * fVar185;
      auVar50._20_4_ = uStack_5d8._4_4_ * fVar187;
      auVar50._24_4_ = (float)uStack_5d0 * fVar188;
      auVar50._28_4_ = fVar160;
      auVar292 = vfnmadd231ps_fma(auVar50,auVar100,local_2c8);
      auVar116._0_4_ = fVar144 * fVar161;
      auVar116._4_4_ = fVar157 * fVar162;
      auVar116._8_4_ = fVar158 * fVar264;
      auVar116._12_4_ = fVar159 * fVar266;
      auVar116._16_4_ = fVar185 * 0.0;
      auVar116._20_4_ = fVar187 * 0.0;
      auVar116._24_4_ = fVar188 * 0.0;
      auVar116._28_4_ = 0;
      auVar78 = vfnmadd231ps_fma(auVar116,auVar100,auVar262);
      auVar51._4_4_ = fVar162 * local_138._4_4_;
      auVar51._0_4_ = fVar161 * local_138._0_4_;
      auVar51._8_4_ = fVar264 * local_138._8_4_;
      auVar51._12_4_ = fVar266 * local_138._12_4_;
      auVar51._16_4_ = fVar185 * local_138._16_4_;
      auVar51._20_4_ = fVar187 * local_138._20_4_;
      auVar51._24_4_ = fVar188 * local_138._24_4_;
      auVar51._28_4_ = auVar18._28_4_;
      auVar110 = vfnmadd213ps_fma(local_f8,auVar100,auVar51);
      auVar52._4_4_ = fVar162 * local_118._4_4_;
      auVar52._0_4_ = fVar161 * local_118._0_4_;
      auVar52._8_4_ = fVar264 * local_118._8_4_;
      auVar52._12_4_ = fVar266 * local_118._12_4_;
      auVar52._16_4_ = fVar185 * local_118._16_4_;
      auVar52._20_4_ = fVar187 * local_118._20_4_;
      auVar52._24_4_ = fVar188 * local_118._24_4_;
      auVar52._28_4_ = auVar18._28_4_;
      auVar6 = vfnmadd213ps_fma(auVar20,auVar100,auVar52);
      auVar53._4_4_ = local_78._4_4_ * fVar162;
      auVar53._0_4_ = local_78._0_4_ * fVar161;
      auVar53._8_4_ = local_78._8_4_ * fVar264;
      auVar53._12_4_ = local_78._12_4_ * fVar266;
      auVar53._16_4_ = local_78._16_4_ * fVar185;
      auVar53._20_4_ = local_78._20_4_ * fVar187;
      auVar53._24_4_ = local_78._24_4_ * fVar188;
      auVar53._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar211 = vfnmadd231ps_fma(auVar53,auVar100,auVar19);
      auVar15 = vminps_avx(ZEXT1632(auVar221),ZEXT1632(auVar13));
      auVar14 = vmaxps_avx(ZEXT1632(auVar221),ZEXT1632(auVar13));
      auVar16 = vminps_avx(ZEXT1632(auVar83),ZEXT1632(auVar292));
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar83),ZEXT1632(auVar292));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(ZEXT1632(auVar78),ZEXT1632(auVar110));
      auVar15 = vmaxps_avx(ZEXT1632(auVar78),ZEXT1632(auVar110));
      auVar18 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar211));
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar211));
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,auVar63,2);
      auVar15 = vcmpps_avx(auVar15,auVar62,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar84 = vandps_avx(auVar84,local_2a8);
      auVar15 = auVar84 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar14,auVar84);
        uVar66 = vmovmskps_avx(auVar84);
      }
    }
    if (uVar66 != 0) {
      auStack_3e8[uVar68] = uVar66;
      uVar164 = vmovlps_avx(local_378);
      *(undefined8 *)(&uStack_288 + uVar68 * 2) = uVar164;
      uVar73 = vmovlps_avx(local_678);
      auStack_58[uVar68] = uVar73;
      uVar68 = (ulong)((int)uVar68 + 1);
    }
    do {
      if ((int)uVar68 == 0) {
        uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar85._4_4_ = uVar76;
        auVar85._0_4_ = uVar76;
        auVar85._8_4_ = uVar76;
        auVar85._12_4_ = uVar76;
        auVar85._16_4_ = uVar76;
        auVar85._20_4_ = uVar76;
        auVar85._24_4_ = uVar76;
        auVar85._28_4_ = uVar76;
        auVar84 = vcmpps_avx(local_1d8,auVar85,2);
        uVar65 = vmovmskps_avx(auVar84);
        uVar65 = (uint)uVar74 & uVar65;
        if (uVar65 == 0) {
          return;
        }
        goto LAB_018b4005;
      }
      uVar67 = (int)uVar68 - 1;
      uVar69 = (ulong)uVar67;
      uVar72 = auStack_3e8[uVar69];
      uVar66 = (&uStack_288)[uVar69 * 2];
      fVar144 = afStack_284[uVar69 * 2];
      iVar21 = 0;
      for (uVar73 = (ulong)uVar72; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        iVar21 = iVar21 + 1;
      }
      uVar72 = uVar72 - 1 & uVar72;
      if (uVar72 == 0) {
        uVar68 = (ulong)uVar67;
      }
      local_678._8_8_ = 0;
      local_678._0_8_ = auStack_58[uVar69];
      auStack_3e8[uVar69] = uVar72;
      fVar157 = (float)(iVar21 + 1) * 0.14285715;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * (float)iVar21 * 0.14285715)),
                                ZEXT416(uVar66),ZEXT416((uint)(1.0 - (float)iVar21 * 0.14285715)));
      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar157)),ZEXT416(uVar66),
                                ZEXT416((uint)(1.0 - fVar157)));
      auVar181._0_4_ = auVar13._0_4_;
      fVar157 = auVar83._0_4_;
      fVar144 = fVar157 - auVar181._0_4_;
      if (0.16666667 <= fVar144) break;
      auVar110 = vshufps_avx(local_678,local_678,0x50);
      auVar106._8_4_ = 0x3f800000;
      auVar106._0_8_ = &DAT_3f8000003f800000;
      auVar106._12_4_ = 0x3f800000;
      auVar6 = vsubps_avx(auVar106,auVar110);
      fVar158 = auVar110._0_4_;
      auVar121._0_4_ = fVar158 * (float)local_438._0_4_;
      fVar159 = auVar110._4_4_;
      auVar121._4_4_ = fVar159 * (float)local_438._4_4_;
      fVar102 = auVar110._8_4_;
      auVar121._8_4_ = fVar102 * fStack_430;
      fVar103 = auVar110._12_4_;
      auVar121._12_4_ = fVar103 * fStack_42c;
      auVar130._0_4_ = fVar158 * (float)local_448._0_4_;
      auVar130._4_4_ = fVar159 * (float)local_448._4_4_;
      auVar130._8_4_ = fVar102 * fStack_440;
      auVar130._12_4_ = fVar103 * fStack_43c;
      auVar149._0_4_ = fVar158 * (float)local_458._0_4_;
      auVar149._4_4_ = fVar159 * (float)local_458._4_4_;
      auVar149._8_4_ = fVar102 * fStack_450;
      auVar149._12_4_ = fVar103 * fStack_44c;
      auVar90._0_4_ = fVar158 * (float)local_468._0_4_;
      auVar90._4_4_ = fVar159 * (float)local_468._4_4_;
      auVar90._8_4_ = fVar102 * fStack_460;
      auVar90._12_4_ = fVar103 * fStack_45c;
      auVar110 = vfmadd231ps_fma(auVar121,auVar6,local_3f8);
      auVar221 = vfmadd231ps_fma(auVar130,auVar6,local_408);
      auVar292 = vfmadd231ps_fma(auVar149,auVar6,local_418);
      auVar6 = vfmadd231ps_fma(auVar90,auVar6,local_428);
      auVar117._16_16_ = auVar110;
      auVar117._0_16_ = auVar110;
      auVar127._16_16_ = auVar221;
      auVar127._0_16_ = auVar221;
      auVar143._16_16_ = auVar292;
      auVar143._0_16_ = auVar292;
      auVar181._4_4_ = auVar181._0_4_;
      auVar181._8_4_ = auVar181._0_4_;
      auVar181._12_4_ = auVar181._0_4_;
      auVar181._20_4_ = fVar157;
      auVar181._16_4_ = fVar157;
      auVar181._24_4_ = fVar157;
      auVar181._28_4_ = fVar157;
      auVar84 = vsubps_avx(auVar127,auVar117);
      auVar221 = vfmadd213ps_fma(auVar84,auVar181,auVar117);
      auVar84 = vsubps_avx(auVar143,auVar127);
      auVar78 = vfmadd213ps_fma(auVar84,auVar181,auVar127);
      auVar110 = vsubps_avx(auVar6,auVar292);
      auVar128._16_16_ = auVar110;
      auVar128._0_16_ = auVar110;
      auVar110 = vfmadd213ps_fma(auVar128,auVar181,auVar143);
      auVar84 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar221));
      auVar6 = vfmadd213ps_fma(auVar84,auVar181,ZEXT1632(auVar221));
      auVar84 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar78));
      auVar110 = vfmadd213ps_fma(auVar84,auVar181,ZEXT1632(auVar78));
      auVar84 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar6));
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar84,auVar181);
      fVar183 = auVar84._4_4_ * 3.0;
      fVar77 = fVar144 * 0.33333334;
      local_2c8._0_8_ =
           CONCAT44(auVar22._4_4_ + fVar77 * fVar183,auVar22._0_4_ + fVar77 * auVar84._0_4_ * 3.0);
      local_2c8._8_4_ = auVar22._8_4_ + fVar77 * auVar84._8_4_ * 3.0;
      local_2c8._12_4_ = auVar22._12_4_ + fVar77 * auVar84._12_4_ * 3.0;
      auVar6 = vshufpd_avx(auVar22,auVar22,3);
      auVar221 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar110 = vsubps_avx(auVar6,auVar22);
      auVar292 = vsubps_avx(auVar221,(undefined1  [16])0x0);
      auVar107._0_4_ = auVar110._0_4_ + auVar292._0_4_;
      auVar107._4_4_ = auVar110._4_4_ + auVar292._4_4_;
      auVar107._8_4_ = auVar110._8_4_ + auVar292._8_4_;
      auVar107._12_4_ = auVar110._12_4_ + auVar292._12_4_;
      auVar110 = vshufps_avx(auVar22,auVar22,0xb1);
      auVar292 = vshufps_avx(local_2c8._0_16_,local_2c8._0_16_,0xb1);
      auVar268._4_4_ = auVar107._0_4_;
      auVar268._0_4_ = auVar107._0_4_;
      auVar268._8_4_ = auVar107._0_4_;
      auVar268._12_4_ = auVar107._0_4_;
      auVar78 = vshufps_avx(auVar107,auVar107,0x55);
      fVar158 = auVar78._0_4_;
      auVar194._0_4_ = auVar110._0_4_ * fVar158;
      fVar159 = auVar78._4_4_;
      auVar194._4_4_ = auVar110._4_4_ * fVar159;
      fVar102 = auVar78._8_4_;
      auVar194._8_4_ = auVar110._8_4_ * fVar102;
      fVar103 = auVar78._12_4_;
      auVar194._12_4_ = auVar110._12_4_ * fVar103;
      auVar209._0_4_ = auVar292._0_4_ * fVar158;
      auVar209._4_4_ = auVar292._4_4_ * fVar159;
      auVar209._8_4_ = auVar292._8_4_ * fVar102;
      auVar209._12_4_ = auVar292._12_4_ * fVar103;
      auVar211 = vfmadd231ps_fma(auVar194,auVar268,auVar22);
      auVar134 = vfmadd231ps_fma(auVar209,auVar268,local_2c8._0_16_);
      auVar292 = vshufps_avx(auVar211,auVar211,0xe8);
      auVar78 = vshufps_avx(auVar134,auVar134,0xe8);
      auVar110 = vcmpps_avx(auVar292,auVar78,1);
      uVar66 = vextractps_avx(auVar110,0);
      auVar86 = auVar134;
      if ((uVar66 & 1) == 0) {
        auVar86 = auVar211;
      }
      auVar131._0_4_ = fVar77 * auVar84._16_4_ * 3.0;
      auVar131._4_4_ = fVar77 * fVar183;
      auVar131._8_4_ = fVar77 * auVar84._24_4_ * 3.0;
      auVar131._12_4_ = fVar77 * fVar157;
      auVar87 = vsubps_avx((undefined1  [16])0x0,auVar131);
      auVar132 = vshufps_avx(auVar87,auVar87,0xb1);
      auVar79 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar291._0_4_ = auVar132._0_4_ * fVar158;
      auVar291._4_4_ = auVar132._4_4_ * fVar159;
      auVar291._8_4_ = auVar132._8_4_ * fVar102;
      auVar291._12_4_ = auVar132._12_4_ * fVar103;
      auVar108._0_4_ = auVar79._0_4_ * fVar158;
      auVar108._4_4_ = auVar79._4_4_ * fVar159;
      auVar108._8_4_ = auVar79._8_4_ * fVar102;
      auVar108._12_4_ = auVar79._12_4_ * fVar103;
      auVar88 = vfmadd231ps_fma(auVar291,auVar268,auVar87);
      auVar89 = vfmadd231ps_fma(auVar108,(undefined1  [16])0x0,auVar268);
      auVar79 = vshufps_avx(auVar88,auVar88,0xe8);
      auVar80 = vshufps_avx(auVar89,auVar89,0xe8);
      auVar132 = vcmpps_avx(auVar79,auVar80,1);
      uVar66 = vextractps_avx(auVar132,0);
      auVar104 = auVar89;
      if ((uVar66 & 1) == 0) {
        auVar104 = auVar88;
      }
      auVar86 = vmaxss_avx(auVar104,auVar86);
      auVar292 = vminps_avx(auVar292,auVar78);
      auVar78 = vminps_avx(auVar79,auVar80);
      auVar78 = vminps_avx(auVar292,auVar78);
      auVar110 = vshufps_avx(auVar110,auVar110,0x55);
      auVar110 = vblendps_avx(auVar110,auVar132,2);
      auVar132 = vpslld_avx(auVar110,0x1f);
      auVar110 = vshufpd_avx(auVar134,auVar134,1);
      auVar110 = vinsertps_avx(auVar110,auVar89,0x9c);
      auVar292 = vshufpd_avx(auVar211,auVar211,1);
      auVar292 = vinsertps_avx(auVar292,auVar88,0x9c);
      auVar110 = vblendvps_avx(auVar292,auVar110,auVar132);
      auVar292 = vmovshdup_avx(auVar110);
      auVar110 = vmaxss_avx(auVar292,auVar110);
      fVar102 = auVar78._0_4_;
      auVar292 = vmovshdup_avx(auVar78);
      fVar159 = auVar110._0_4_;
      fVar158 = auVar86._0_4_;
      if ((0.0001 <= fVar102) || (fVar159 <= -0.0001)) {
        auVar211 = vcmpps_avx(auVar292,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar134 = vcmpps_avx(auVar78,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar211 = vorps_avx(auVar134,auVar211);
        if ((-0.0001 < fVar158 & auVar211[0]) != 0) goto LAB_018b509d;
        auVar211 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar110,5);
        auVar134 = vcmpps_avx(auVar292,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar211 = vorps_avx(auVar134,auVar211);
        if ((auVar211 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_018b509d;
LAB_018b5a62:
        bVar54 = true;
      }
      else {
LAB_018b509d:
        auVar134 = vcmpps_avx(auVar78,_DAT_01feba10,1);
        auVar132 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar211 = vcmpss_avx(auVar86,ZEXT816(0) << 0x20,1);
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = &DAT_3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar210._8_4_ = 0xbf800000;
        auVar210._0_8_ = 0xbf800000bf800000;
        auVar210._12_4_ = 0xbf800000;
        auVar211 = vblendvps_avx(auVar150,auVar210,auVar211);
        auVar134 = vblendvps_avx(auVar150,auVar210,auVar134);
        fVar103 = auVar134._0_4_;
        fVar77 = auVar211._0_4_;
        auVar211 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar103 == fVar77) && (!NAN(fVar103) && !NAN(fVar77))) {
          auVar211 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar103 == fVar77) && (!NAN(fVar103) && !NAN(fVar77))) {
          auVar132 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar134 = vmovshdup_avx(auVar134);
        fVar183 = auVar134._0_4_;
        fVar160 = auVar292._0_4_;
        auVar292 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar103 != fVar183) || (NAN(fVar103) || NAN(fVar183))) {
          if ((fVar160 != fVar102) || (NAN(fVar160) || NAN(fVar102))) {
            auVar109._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar109._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar109._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar133._0_4_ = -fVar102 / (fVar160 - fVar102);
            auVar133._4_12_ = auVar109._4_12_;
            auVar55._12_4_ = 0;
            auVar55._0_12_ = ZEXT812(0);
            auVar57._12_4_ = 0;
            auVar57._0_12_ = ZEXT812(0);
            auVar281 = auVar57 << 0x20;
            auVar78 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar133._0_4_)),auVar55 << 0x20,auVar133
                                     );
            auVar134 = auVar78;
          }
          else {
            auVar78 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar102 == 0.0) && (auVar78 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar102))) {
              auVar78 = ZEXT816(0);
            }
            auVar281._12_4_ = 0;
            auVar281._0_12_ = ZEXT812(0);
            auVar281 = auVar281 << 0x20;
            auVar134 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar102 == 0.0) && (auVar134 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar102))) {
              auVar134 = auVar292;
            }
          }
          auVar211 = vminss_avx(auVar211,auVar78);
          auVar132 = vmaxss_avx(auVar134,auVar132);
        }
        else {
          auVar56._12_4_ = 0;
          auVar56._0_12_ = ZEXT812(0);
          auVar281 = auVar56 << 0x20;
        }
        auVar110 = vcmpss_avx(auVar110,auVar281,1);
        auVar135._8_4_ = 0x3f800000;
        auVar135._0_8_ = &DAT_3f8000003f800000;
        auVar135._12_4_ = 0x3f800000;
        auVar151._8_4_ = 0xbf800000;
        auVar151._0_8_ = 0xbf800000bf800000;
        auVar151._12_4_ = 0xbf800000;
        auVar110 = vblendvps_avx(auVar135,auVar151,auVar110);
        fVar102 = auVar110._0_4_;
        if ((fVar77 != fVar102) || (NAN(fVar77) || NAN(fVar102))) {
          if ((fVar159 != fVar158) || (NAN(fVar159) || NAN(fVar158))) {
            auVar111._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
            auVar111._8_4_ = auVar86._8_4_ ^ 0x80000000;
            auVar111._12_4_ = auVar86._12_4_ ^ 0x80000000;
            auVar136._0_4_ = -fVar158 / (fVar159 - fVar158);
            auVar136._4_12_ = auVar111._4_12_;
            auVar110 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar136._0_4_)),auVar281,auVar136);
            auVar78 = auVar110;
          }
          else {
            auVar110 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar158 == 0.0) && (auVar110 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar158))) {
              auVar110 = ZEXT816(0);
            }
            auVar78 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar158 == 0.0) && (auVar78 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar158))) {
              auVar78 = auVar292;
            }
          }
          auVar211 = vminss_avx(auVar211,auVar110);
          auVar132 = vmaxss_avx(auVar78,auVar132);
        }
        if ((fVar183 != fVar102) || (NAN(fVar183) || NAN(fVar102))) {
          auVar211 = vminss_avx(auVar211,auVar292);
          auVar132 = vmaxss_avx(auVar292,auVar132);
        }
        auVar110 = vmaxss_avx(auVar281,auVar211);
        auVar78 = vminss_avx(auVar132,auVar292);
        bVar54 = true;
        if (auVar110._0_4_ <= auVar78._0_4_) {
          auVar110 = vmaxss_avx(auVar281,ZEXT416((uint)(auVar110._0_4_ + -0.1)));
          auVar292 = vminss_avx(ZEXT416((uint)(auVar78._0_4_ + 0.1)),auVar292);
          auVar91._0_8_ = auVar22._0_8_;
          auVar91._8_8_ = auVar91._0_8_;
          auVar212._8_8_ = local_2c8._0_8_;
          auVar212._0_8_ = local_2c8._0_8_;
          auVar225._8_8_ = auVar87._0_8_;
          auVar225._0_8_ = auVar87._0_8_;
          auVar78 = vshufpd_avx(local_2c8._0_16_,local_2c8._0_16_,3);
          auVar211 = vshufpd_avx(auVar87,auVar87,3);
          auVar134 = vshufps_avx(auVar110,auVar292,0);
          auVar122._8_4_ = 0x3f800000;
          auVar122._0_8_ = &DAT_3f8000003f800000;
          auVar122._12_4_ = 0x3f800000;
          auVar22 = vsubps_avx(auVar122,auVar134);
          local_5b8._0_4_ = auVar6._0_4_;
          local_5b8._4_4_ = auVar6._4_4_;
          fStack_5b0 = auVar6._8_4_;
          fStack_5ac = auVar6._12_4_;
          fVar158 = auVar134._0_4_;
          auVar123._0_4_ = fVar158 * (float)local_5b8._0_4_;
          fVar159 = auVar134._4_4_;
          auVar123._4_4_ = fVar159 * (float)local_5b8._4_4_;
          fVar102 = auVar134._8_4_;
          auVar123._8_4_ = fVar102 * fStack_5b0;
          fVar103 = auVar134._12_4_;
          auVar123._12_4_ = fVar103 * fStack_5ac;
          auVar137._0_4_ = auVar78._0_4_ * fVar158;
          auVar137._4_4_ = auVar78._4_4_ * fVar159;
          auVar137._8_4_ = auVar78._8_4_ * fVar102;
          auVar137._12_4_ = auVar78._12_4_ * fVar103;
          auVar152._0_4_ = auVar211._0_4_ * fVar158;
          auVar152._4_4_ = auVar211._4_4_ * fVar159;
          auVar152._8_4_ = auVar211._8_4_ * fVar102;
          auVar152._12_4_ = auVar211._12_4_ * fVar103;
          local_5e8._0_4_ = auVar221._0_4_;
          local_5e8._4_4_ = auVar221._4_4_;
          uStack_5e0._0_4_ = auVar221._8_4_;
          uStack_5e0._4_4_ = auVar221._12_4_;
          auVar176._0_4_ = fVar158 * (float)local_5e8._0_4_;
          auVar176._4_4_ = fVar159 * (float)local_5e8._4_4_;
          auVar176._8_4_ = fVar102 * (float)uStack_5e0;
          auVar176._12_4_ = fVar103 * uStack_5e0._4_4_;
          auVar78 = vfmadd231ps_fma(auVar123,auVar22,auVar91);
          auVar211 = vfmadd231ps_fma(auVar137,auVar22,auVar212);
          auVar134 = vfmadd231ps_fma(auVar152,auVar22,auVar225);
          auVar22 = vfmadd231ps_fma(auVar176,auVar22,ZEXT816(0));
          auVar6 = vmovshdup_avx(local_678);
          auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar110._0_4_)),local_678,
                                    ZEXT416((uint)(1.0 - auVar110._0_4_)));
          auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar292._0_4_)),local_678,
                                    ZEXT416((uint)(1.0 - auVar292._0_4_)));
          fVar158 = 1.0 / fVar144;
          auVar110 = vsubps_avx(auVar211,auVar78);
          auVar195._0_4_ = auVar110._0_4_ * 3.0;
          auVar195._4_4_ = auVar110._4_4_ * 3.0;
          auVar195._8_4_ = auVar110._8_4_ * 3.0;
          auVar195._12_4_ = auVar110._12_4_ * 3.0;
          auVar110 = vsubps_avx(auVar134,auVar211);
          auVar213._0_4_ = auVar110._0_4_ * 3.0;
          auVar213._4_4_ = auVar110._4_4_ * 3.0;
          auVar213._8_4_ = auVar110._8_4_ * 3.0;
          auVar213._12_4_ = auVar110._12_4_ * 3.0;
          auVar110 = vsubps_avx(auVar22,auVar134);
          auVar226._0_4_ = auVar110._0_4_ * 3.0;
          auVar226._4_4_ = auVar110._4_4_ * 3.0;
          auVar226._8_4_ = auVar110._8_4_ * 3.0;
          auVar226._12_4_ = auVar110._12_4_ * 3.0;
          auVar6 = vminps_avx(auVar213,auVar226);
          auVar110 = vmaxps_avx(auVar213,auVar226);
          auVar6 = vminps_avx(auVar195,auVar6);
          auVar110 = vmaxps_avx(auVar195,auVar110);
          auVar221 = vshufpd_avx(auVar6,auVar6,3);
          auVar292 = vshufpd_avx(auVar110,auVar110,3);
          auVar6 = vminps_avx(auVar6,auVar221);
          auVar110 = vmaxps_avx(auVar110,auVar292);
          auVar214._0_4_ = auVar6._0_4_ * fVar158;
          auVar214._4_4_ = auVar6._4_4_ * fVar158;
          auVar214._8_4_ = auVar6._8_4_ * fVar158;
          auVar214._12_4_ = auVar6._12_4_ * fVar158;
          auVar196._0_4_ = fVar158 * auVar110._0_4_;
          auVar196._4_4_ = fVar158 * auVar110._4_4_;
          auVar196._8_4_ = fVar158 * auVar110._8_4_;
          auVar196._12_4_ = fVar158 * auVar110._12_4_;
          fVar158 = 1.0 / (auVar80._0_4_ - auVar79._0_4_);
          auVar110 = vshufpd_avx(auVar78,auVar78,3);
          auVar6 = vshufpd_avx(auVar211,auVar211,3);
          auVar221 = vshufpd_avx(auVar134,auVar134,3);
          auVar292 = vshufpd_avx(auVar22,auVar22,3);
          auVar110 = vsubps_avx(auVar110,auVar78);
          auVar78 = vsubps_avx(auVar6,auVar211);
          auVar211 = vsubps_avx(auVar221,auVar134);
          auVar292 = vsubps_avx(auVar292,auVar22);
          auVar6 = vminps_avx(auVar110,auVar78);
          auVar110 = vmaxps_avx(auVar110,auVar78);
          auVar221 = vminps_avx(auVar211,auVar292);
          auVar221 = vminps_avx(auVar6,auVar221);
          auVar6 = vmaxps_avx(auVar211,auVar292);
          auVar110 = vmaxps_avx(auVar110,auVar6);
          auVar246._0_4_ = fVar158 * auVar221._0_4_;
          auVar246._4_4_ = fVar158 * auVar221._4_4_;
          auVar246._8_4_ = fVar158 * auVar221._8_4_;
          auVar246._12_4_ = fVar158 * auVar221._12_4_;
          auVar232._0_4_ = fVar158 * auVar110._0_4_;
          auVar232._4_4_ = fVar158 * auVar110._4_4_;
          auVar232._8_4_ = fVar158 * auVar110._8_4_;
          auVar232._12_4_ = fVar158 * auVar110._12_4_;
          auVar292 = vinsertps_avx(auVar13,auVar79,0x10);
          auVar78 = vinsertps_avx(auVar83,auVar80,0x10);
          auVar82._0_4_ = (auVar292._0_4_ + auVar78._0_4_) * 0.5;
          auVar82._4_4_ = (auVar292._4_4_ + auVar78._4_4_) * 0.5;
          auVar82._8_4_ = (auVar292._8_4_ + auVar78._8_4_) * 0.5;
          auVar82._12_4_ = (auVar292._12_4_ + auVar78._12_4_) * 0.5;
          auVar124._4_4_ = auVar82._0_4_;
          auVar124._0_4_ = auVar82._0_4_;
          auVar124._8_4_ = auVar82._0_4_;
          auVar124._12_4_ = auVar82._0_4_;
          auVar110 = vfmadd213ps_fma(local_2d8,auVar124,auVar3);
          auVar6 = vfmadd213ps_fma(local_2e8,auVar124,auVar4);
          auVar221 = vfmadd213ps_fma(local_2f8,auVar124,auVar5);
          auVar83 = vsubps_avx(auVar6,auVar110);
          auVar110 = vfmadd213ps_fma(auVar83,auVar124,auVar110);
          auVar83 = vsubps_avx(auVar221,auVar6);
          auVar83 = vfmadd213ps_fma(auVar83,auVar124,auVar6);
          auVar83 = vsubps_avx(auVar83,auVar110);
          auVar110 = vfmadd231ps_fma(auVar110,auVar83,auVar124);
          auVar125._0_8_ = CONCAT44(auVar83._4_4_ * 3.0,auVar83._0_4_ * 3.0);
          auVar125._8_4_ = auVar83._8_4_ * 3.0;
          auVar125._12_4_ = auVar83._12_4_ * 3.0;
          auVar227._8_8_ = auVar110._0_8_;
          auVar227._0_8_ = auVar110._0_8_;
          auVar83 = vshufpd_avx(auVar110,auVar110,3);
          auVar110 = vshufps_avx(auVar82,auVar82,0x55);
          auVar211 = vsubps_avx(auVar83,auVar227);
          auVar22 = vfmadd231ps_fma(auVar227,auVar110,auVar211);
          auVar269._8_8_ = auVar125._0_8_;
          auVar269._0_8_ = auVar125._0_8_;
          auVar83 = vshufpd_avx(auVar125,auVar125,3);
          auVar83 = vsubps_avx(auVar83,auVar269);
          auVar134 = vfmadd213ps_fma(auVar83,auVar110,auVar269);
          auVar110 = vmovshdup_avx(auVar134);
          auVar270._0_8_ = auVar110._0_8_ ^ 0x8000000080000000;
          auVar270._8_4_ = auVar110._8_4_ ^ 0x80000000;
          auVar270._12_4_ = auVar110._12_4_ ^ 0x80000000;
          auVar6 = vmovshdup_avx(auVar211);
          auVar83 = vunpcklps_avx(auVar6,auVar270);
          auVar221 = vshufps_avx(auVar83,auVar270,4);
          auVar293._0_8_ = auVar211._0_8_ ^ 0x8000000080000000;
          auVar293._8_4_ = auVar211._8_4_ ^ 0x80000000;
          auVar293._12_4_ = auVar211._12_4_ ^ 0x80000000;
          auVar83 = vmovlhps_avx(auVar293,auVar134);
          auVar83 = vshufps_avx(auVar83,auVar134,8);
          auVar110 = vfmsub231ss_fma(ZEXT416((uint)(auVar110._0_4_ * auVar211._0_4_)),auVar6,
                                     auVar134);
          auVar138._0_4_ = auVar110._0_4_;
          auVar138._4_4_ = auVar138._0_4_;
          auVar138._8_4_ = auVar138._0_4_;
          auVar138._12_4_ = auVar138._0_4_;
          auVar110 = vdivps_avx(auVar221,auVar138);
          auVar6 = vdivps_avx(auVar83,auVar138);
          fVar102 = auVar22._0_4_;
          fVar158 = auVar110._0_4_;
          auVar83 = vshufps_avx(auVar22,auVar22,0x55);
          fVar159 = auVar6._0_4_;
          local_5e8._4_4_ = fVar102 * auVar110._4_4_ + auVar83._4_4_ * auVar6._4_4_;
          local_5e8._0_4_ = fVar102 * fVar158 + auVar83._0_4_ * fVar159;
          uStack_5e0._0_4_ = fVar102 * auVar110._8_4_ + auVar83._8_4_ * auVar6._8_4_;
          uStack_5e0._4_4_ = fVar102 * auVar110._12_4_ + auVar83._12_4_ * auVar6._12_4_;
          auVar211 = vmovshdup_avx(auVar110);
          auVar83 = vinsertps_avx(auVar214,auVar246,0x1c);
          auVar282._0_4_ = auVar211._0_4_ * auVar83._0_4_;
          auVar282._4_4_ = auVar211._4_4_ * auVar83._4_4_;
          auVar282._8_4_ = auVar211._8_4_ * auVar83._8_4_;
          auVar282._12_4_ = auVar211._12_4_ * auVar83._12_4_;
          auVar221 = vinsertps_avx(auVar196,auVar232,0x1c);
          auVar255._0_4_ = auVar211._0_4_ * auVar221._0_4_;
          auVar255._4_4_ = auVar211._4_4_ * auVar221._4_4_;
          auVar255._8_4_ = auVar211._8_4_ * auVar221._8_4_;
          auVar255._12_4_ = auVar211._12_4_ * auVar221._12_4_;
          auVar86 = vminps_avx(auVar282,auVar255);
          auVar22 = vmaxps_avx(auVar255,auVar282);
          auVar211 = vinsertps_avx(auVar246,auVar214,0x4c);
          auVar132 = vmovshdup_avx(auVar6);
          auVar134 = vinsertps_avx(auVar232,auVar196,0x4c);
          auVar233._0_4_ = auVar132._0_4_ * auVar211._0_4_;
          auVar233._4_4_ = auVar132._4_4_ * auVar211._4_4_;
          auVar233._8_4_ = auVar132._8_4_ * auVar211._8_4_;
          auVar233._12_4_ = auVar132._12_4_ * auVar211._12_4_;
          auVar247._0_4_ = auVar132._0_4_ * auVar134._0_4_;
          auVar247._4_4_ = auVar132._4_4_ * auVar134._4_4_;
          auVar247._8_4_ = auVar132._8_4_ * auVar134._8_4_;
          auVar247._12_4_ = auVar132._12_4_ * auVar134._12_4_;
          auVar132 = vminps_avx(auVar233,auVar247);
          auVar92._0_4_ = auVar132._0_4_ + auVar86._0_4_;
          auVar92._4_4_ = auVar132._4_4_ + auVar86._4_4_;
          auVar92._8_4_ = auVar132._8_4_ + auVar86._8_4_;
          auVar92._12_4_ = auVar132._12_4_ + auVar86._12_4_;
          auVar86 = vmaxps_avx(auVar247,auVar233);
          auVar234._0_4_ = auVar22._0_4_ + auVar86._0_4_;
          auVar234._4_4_ = auVar22._4_4_ + auVar86._4_4_;
          auVar234._8_4_ = auVar22._8_4_ + auVar86._8_4_;
          auVar234._12_4_ = auVar22._12_4_ + auVar86._12_4_;
          auVar248._8_8_ = 0x3f80000000000000;
          auVar248._0_8_ = 0x3f80000000000000;
          auVar22 = vsubps_avx(auVar248,auVar234);
          auVar86 = vsubps_avx(auVar248,auVar92);
          auVar132 = vsubps_avx(auVar292,auVar82);
          auVar271._0_4_ = fVar158 * auVar83._0_4_;
          auVar271._4_4_ = fVar158 * auVar83._4_4_;
          auVar271._8_4_ = fVar158 * auVar83._8_4_;
          auVar271._12_4_ = fVar158 * auVar83._12_4_;
          auVar256._0_4_ = fVar158 * auVar221._0_4_;
          auVar256._4_4_ = fVar158 * auVar221._4_4_;
          auVar256._8_4_ = fVar158 * auVar221._8_4_;
          auVar256._12_4_ = fVar158 * auVar221._12_4_;
          auVar221 = vminps_avx(auVar271,auVar256);
          auVar83 = vmaxps_avx(auVar256,auVar271);
          auVar215._0_4_ = fVar159 * auVar211._0_4_;
          auVar215._4_4_ = fVar159 * auVar211._4_4_;
          auVar215._8_4_ = fVar159 * auVar211._8_4_;
          auVar215._12_4_ = fVar159 * auVar211._12_4_;
          auVar197._0_4_ = fVar159 * auVar134._0_4_;
          auVar197._4_4_ = fVar159 * auVar134._4_4_;
          auVar197._8_4_ = fVar159 * auVar134._8_4_;
          auVar197._12_4_ = fVar159 * auVar134._12_4_;
          auVar211 = vminps_avx(auVar215,auVar197);
          auVar272._0_4_ = auVar221._0_4_ + auVar211._0_4_;
          auVar272._4_4_ = auVar221._4_4_ + auVar211._4_4_;
          auVar272._8_4_ = auVar221._8_4_ + auVar211._8_4_;
          auVar272._12_4_ = auVar221._12_4_ + auVar211._12_4_;
          auVar211 = vsubps_avx(auVar78,auVar82);
          auVar221 = vmaxps_avx(auVar197,auVar215);
          fVar102 = auVar132._0_4_;
          auVar216._0_4_ = fVar102 * auVar22._0_4_;
          fVar103 = auVar132._4_4_;
          auVar216._4_4_ = fVar103 * auVar22._4_4_;
          fVar77 = auVar132._8_4_;
          auVar216._8_4_ = fVar77 * auVar22._8_4_;
          fVar183 = auVar132._12_4_;
          auVar216._12_4_ = fVar183 * auVar22._12_4_;
          auVar198._0_4_ = auVar83._0_4_ + auVar221._0_4_;
          auVar198._4_4_ = auVar83._4_4_ + auVar221._4_4_;
          auVar198._8_4_ = auVar83._8_4_ + auVar221._8_4_;
          auVar198._12_4_ = auVar83._12_4_ + auVar221._12_4_;
          auVar257._8_8_ = 0x3f800000;
          auVar257._0_8_ = 0x3f800000;
          auVar83 = vsubps_avx(auVar257,auVar198);
          auVar221 = vsubps_avx(auVar257,auVar272);
          auVar273._0_4_ = fVar102 * auVar86._0_4_;
          auVar273._4_4_ = fVar103 * auVar86._4_4_;
          auVar273._8_4_ = fVar77 * auVar86._8_4_;
          auVar273._12_4_ = fVar183 * auVar86._12_4_;
          fVar160 = auVar211._0_4_;
          auVar235._0_4_ = fVar160 * auVar22._0_4_;
          fVar161 = auVar211._4_4_;
          auVar235._4_4_ = fVar161 * auVar22._4_4_;
          fVar162 = auVar211._8_4_;
          auVar235._8_4_ = fVar162 * auVar22._8_4_;
          fVar252 = auVar211._12_4_;
          auVar235._12_4_ = fVar252 * auVar22._12_4_;
          auVar93._0_4_ = fVar160 * auVar86._0_4_;
          auVar93._4_4_ = fVar161 * auVar86._4_4_;
          auVar93._8_4_ = fVar162 * auVar86._8_4_;
          auVar93._12_4_ = fVar252 * auVar86._12_4_;
          auVar294._0_4_ = fVar102 * auVar83._0_4_;
          auVar294._4_4_ = fVar103 * auVar83._4_4_;
          auVar294._8_4_ = fVar77 * auVar83._8_4_;
          auVar294._12_4_ = fVar183 * auVar83._12_4_;
          auVar249._0_4_ = fVar102 * auVar221._0_4_;
          auVar249._4_4_ = fVar103 * auVar221._4_4_;
          auVar249._8_4_ = fVar77 * auVar221._8_4_;
          auVar249._12_4_ = fVar183 * auVar221._12_4_;
          auVar199._0_4_ = fVar160 * auVar83._0_4_;
          auVar199._4_4_ = fVar161 * auVar83._4_4_;
          auVar199._8_4_ = fVar162 * auVar83._8_4_;
          auVar199._12_4_ = fVar252 * auVar83._12_4_;
          auVar258._0_4_ = fVar160 * auVar221._0_4_;
          auVar258._4_4_ = fVar161 * auVar221._4_4_;
          auVar258._8_4_ = fVar162 * auVar221._8_4_;
          auVar258._12_4_ = fVar252 * auVar221._12_4_;
          auVar83 = vminps_avx(auVar294,auVar249);
          auVar221 = vminps_avx(auVar199,auVar258);
          auVar83 = vminps_avx(auVar83,auVar221);
          auVar221 = vmaxps_avx(auVar249,auVar294);
          auVar211 = vminps_avx(auVar216,auVar273);
          auVar134 = vminps_avx(auVar235,auVar93);
          auVar211 = vminps_avx(auVar211,auVar134);
          auVar83 = vhaddps_avx(auVar83,auVar211);
          auVar211 = vmaxps_avx(auVar258,auVar199);
          auVar221 = vmaxps_avx(auVar211,auVar221);
          auVar211 = vmaxps_avx(auVar273,auVar216);
          auVar134 = vmaxps_avx(auVar93,auVar235);
          auVar211 = vmaxps_avx(auVar134,auVar211);
          auVar221 = vhaddps_avx(auVar221,auVar211);
          auVar211 = vshufps_avx(auVar82,auVar82,0x54);
          auVar211 = vsubps_avx(auVar211,_local_5e8);
          auVar83 = vshufps_avx(auVar83,auVar83,0xe8);
          auVar221 = vshufps_avx(auVar221,auVar221,0xe8);
          auVar217._0_4_ = auVar211._0_4_ + auVar83._0_4_;
          auVar217._4_4_ = auVar211._4_4_ + auVar83._4_4_;
          auVar217._8_4_ = auVar211._8_4_ + auVar83._8_4_;
          auVar217._12_4_ = auVar211._12_4_ + auVar83._12_4_;
          auVar200._0_4_ = auVar211._0_4_ + auVar221._0_4_;
          auVar200._4_4_ = auVar211._4_4_ + auVar221._4_4_;
          auVar200._8_4_ = auVar211._8_4_ + auVar221._8_4_;
          auVar200._12_4_ = auVar211._12_4_ + auVar221._12_4_;
          auVar83 = vmaxps_avx(auVar292,auVar217);
          auVar221 = vminps_avx(auVar200,auVar78);
          auVar83 = vcmpps_avx(auVar221,auVar83,1);
          auVar83 = vshufps_avx(auVar83,auVar83,0x50);
          local_678 = vinsertps_avx(auVar79,ZEXT416((uint)auVar80._0_4_),0x10);
          if ((auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar83[0xf] < '\0') goto LAB_018b5a62;
          bVar71 = 0;
          if (auVar217._0_4_ <= auVar181._0_4_) {
            auVar283._8_4_ = 0x7fffffff;
            auVar283._0_8_ = 0x7fffffff7fffffff;
            auVar283._12_4_ = 0x7fffffff;
          }
          else {
            auVar283._8_4_ = 0x7fffffff;
            auVar283._0_8_ = 0x7fffffff7fffffff;
            auVar283._12_4_ = 0x7fffffff;
            bVar71 = 0;
            if (auVar200._0_4_ < auVar78._0_4_) {
              auVar221 = vmovshdup_avx(auVar217);
              auVar83 = vcmpps_avx(auVar200,auVar78,1);
              bVar71 = auVar83[4] & auVar79._0_4_ < auVar221._0_4_;
            }
          }
          if (((3 < (uint)uVar68 || fVar144 < 0.001) | bVar71) == 1) {
            lVar70 = 200;
            do {
              fVar77 = auVar211._0_4_;
              fVar103 = 1.0 - fVar77;
              fVar144 = fVar103 * fVar103 * fVar103;
              fVar102 = fVar77 * 3.0 * fVar103 * fVar103;
              fVar103 = fVar103 * fVar77 * fVar77 * 3.0;
              auVar153._4_4_ = fVar144;
              auVar153._0_4_ = fVar144;
              auVar153._8_4_ = fVar144;
              auVar153._12_4_ = fVar144;
              auVar112._4_4_ = fVar102;
              auVar112._0_4_ = fVar102;
              auVar112._8_4_ = fVar102;
              auVar112._12_4_ = fVar102;
              auVar94._4_4_ = fVar103;
              auVar94._0_4_ = fVar103;
              auVar94._8_4_ = fVar103;
              auVar94._12_4_ = fVar103;
              fVar77 = fVar77 * fVar77 * fVar77;
              auVar177._0_4_ = (float)local_478._0_4_ * fVar77;
              auVar177._4_4_ = (float)local_478._4_4_ * fVar77;
              auVar177._8_4_ = fStack_470 * fVar77;
              auVar177._12_4_ = fStack_46c * fVar77;
              auVar83 = vfmadd231ps_fma(auVar177,auVar5,auVar94);
              auVar83 = vfmadd231ps_fma(auVar83,auVar4,auVar112);
              auVar83 = vfmadd231ps_fma(auVar83,auVar3,auVar153);
              auVar95._8_8_ = auVar83._0_8_;
              auVar95._0_8_ = auVar83._0_8_;
              auVar83 = vshufpd_avx(auVar83,auVar83,3);
              auVar221 = vshufps_avx(auVar211,auVar211,0x55);
              auVar83 = vsubps_avx(auVar83,auVar95);
              auVar221 = vfmadd213ps_fma(auVar83,auVar221,auVar95);
              fVar144 = auVar221._0_4_;
              auVar83 = vshufps_avx(auVar221,auVar221,0x55);
              auVar96._0_4_ = fVar158 * fVar144 + fVar159 * auVar83._0_4_;
              auVar96._4_4_ = auVar110._4_4_ * fVar144 + auVar6._4_4_ * auVar83._4_4_;
              auVar96._8_4_ = auVar110._8_4_ * fVar144 + auVar6._8_4_ * auVar83._8_4_;
              auVar96._12_4_ = auVar110._12_4_ * fVar144 + auVar6._12_4_ * auVar83._12_4_;
              auVar211 = vsubps_avx(auVar211,auVar96);
              auVar83 = vandps_avx(auVar283,auVar221);
              auVar221 = vshufps_avx(auVar83,auVar83,0xf5);
              auVar83 = vmaxss_avx(auVar221,auVar83);
              if (auVar83._0_4_ < (float)local_308._0_4_) {
                local_238 = auVar211._0_4_;
                if ((0.0 <= local_238) && (local_238 <= 1.0)) {
                  auVar83 = vmovshdup_avx(auVar211);
                  fVar144 = auVar83._0_4_;
                  if ((0.0 <= fVar144) && (fVar144 <= 1.0)) {
                    auVar83 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar22 = vinsertps_avx(auVar83,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar83 = vdpps_avx(auVar22,local_488,0x7f);
                    auVar110 = vdpps_avx(auVar22,local_498,0x7f);
                    auVar6 = vdpps_avx(auVar22,local_318,0x7f);
                    auVar221 = vdpps_avx(auVar22,local_328,0x7f);
                    auVar292 = vdpps_avx(auVar22,local_338,0x7f);
                    auVar78 = vdpps_avx(auVar22,local_348,0x7f);
                    auVar134 = vdpps_avx(auVar22,local_358,0x7f);
                    auVar22 = vdpps_avx(auVar22,local_368,0x7f);
                    fVar158 = 1.0 - fVar144;
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * auVar292._0_4_)),
                                              ZEXT416((uint)fVar158),auVar83);
                    auVar110 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ * fVar144)),
                                               ZEXT416((uint)fVar158),auVar110);
                    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar134._0_4_ * fVar144)),
                                             ZEXT416((uint)fVar158),auVar6);
                    auVar221 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * auVar22._0_4_)),
                                               ZEXT416((uint)fVar158),auVar221);
                    fVar103 = 1.0 - local_238;
                    fVar158 = fVar103 * local_238 * local_238 * 3.0;
                    fVar183 = local_238 * local_238 * local_238;
                    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * auVar221._0_4_)),
                                             ZEXT416((uint)fVar158),auVar6);
                    fVar159 = local_238 * 3.0 * fVar103 * fVar103;
                    auVar110 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar159),auVar110);
                    fVar102 = fVar103 * fVar103 * fVar103;
                    auVar83 = vfmadd231ss_fma(auVar110,ZEXT416((uint)fVar102),auVar83);
                    fVar77 = auVar83._0_4_;
                    if (((fVar75 <= fVar77) &&
                        (fVar160 = *(float *)(ray + k * 4 + 0x80), fVar77 <= fVar160)) &&
                       (pGVar9 = (context->scene->geometries).items[uVar65].ptr,
                       (pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                      auVar83 = vshufps_avx(auVar211,auVar211,0x55);
                      auVar228._8_4_ = 0x3f800000;
                      auVar228._0_8_ = &DAT_3f8000003f800000;
                      auVar228._12_4_ = 0x3f800000;
                      auVar110 = vsubps_avx(auVar228,auVar83);
                      fVar161 = auVar83._0_4_;
                      auVar236._0_4_ = fVar161 * (float)local_4b8._0_4_;
                      fVar162 = auVar83._4_4_;
                      auVar236._4_4_ = fVar162 * (float)local_4b8._4_4_;
                      fVar252 = auVar83._8_4_;
                      auVar236._8_4_ = fVar252 * fStack_4b0;
                      fVar264 = auVar83._12_4_;
                      auVar236._12_4_ = fVar264 * fStack_4ac;
                      auVar250._0_4_ = fVar161 * (float)local_4f8._0_4_;
                      auVar250._4_4_ = fVar162 * (float)local_4f8._4_4_;
                      auVar250._8_4_ = fVar252 * fStack_4f0;
                      auVar250._12_4_ = fVar264 * fStack_4ec;
                      auVar259._0_4_ = fVar161 * (float)local_508._0_4_;
                      auVar259._4_4_ = fVar162 * (float)local_508._4_4_;
                      auVar259._8_4_ = fVar252 * fStack_500;
                      auVar259._12_4_ = fVar264 * fStack_4fc;
                      auVar274._0_4_ = fVar161 * fVar163;
                      auVar274._4_4_ = fVar162 * fVar182;
                      auVar274._8_4_ = fVar252 * fVar184;
                      auVar274._12_4_ = fVar264 * fVar186;
                      auVar6 = vfmadd231ps_fma(auVar236,auVar110,local_4a8);
                      auVar221 = vfmadd231ps_fma(auVar250,auVar110,local_4d8);
                      auVar292 = vfmadd231ps_fma(auVar259,auVar110,local_4e8);
                      auVar78 = vfmadd231ps_fma(auVar274,auVar110,local_4c8);
                      auVar110 = vsubps_avx(auVar221,auVar6);
                      auVar6 = vsubps_avx(auVar292,auVar221);
                      auVar221 = vsubps_avx(auVar78,auVar292);
                      auVar275._0_4_ = local_238 * auVar6._0_4_;
                      auVar275._4_4_ = local_238 * auVar6._4_4_;
                      auVar275._8_4_ = local_238 * auVar6._8_4_;
                      auVar275._12_4_ = local_238 * auVar6._12_4_;
                      auVar218._4_4_ = fVar103;
                      auVar218._0_4_ = fVar103;
                      auVar218._8_4_ = fVar103;
                      auVar218._12_4_ = fVar103;
                      auVar110 = vfmadd231ps_fma(auVar275,auVar218,auVar110);
                      auVar237._0_4_ = local_238 * auVar221._0_4_;
                      auVar237._4_4_ = local_238 * auVar221._4_4_;
                      auVar237._8_4_ = local_238 * auVar221._8_4_;
                      auVar237._12_4_ = local_238 * auVar221._12_4_;
                      auVar6 = vfmadd231ps_fma(auVar237,auVar218,auVar6);
                      auVar238._0_4_ = local_238 * auVar6._0_4_;
                      auVar238._4_4_ = local_238 * auVar6._4_4_;
                      auVar238._8_4_ = local_238 * auVar6._8_4_;
                      auVar238._12_4_ = local_238 * auVar6._12_4_;
                      auVar6 = vfmadd231ps_fma(auVar238,auVar218,auVar110);
                      auVar201._0_4_ = fVar183 * (float)local_3b8._0_4_;
                      auVar201._4_4_ = fVar183 * (float)local_3b8._4_4_;
                      auVar201._8_4_ = fVar183 * fStack_3b0;
                      auVar201._12_4_ = fVar183 * fStack_3ac;
                      auVar139._4_4_ = fVar158;
                      auVar139._0_4_ = fVar158;
                      auVar139._8_4_ = fVar158;
                      auVar139._12_4_ = fVar158;
                      auVar110 = vfmadd132ps_fma(auVar139,auVar201,local_3a8);
                      auVar178._4_4_ = fVar159;
                      auVar178._0_4_ = fVar159;
                      auVar178._8_4_ = fVar159;
                      auVar178._12_4_ = fVar159;
                      auVar110 = vfmadd132ps_fma(auVar178,auVar110,local_398);
                      auVar202._0_4_ = auVar6._0_4_ * 3.0;
                      auVar202._4_4_ = auVar6._4_4_ * 3.0;
                      auVar202._8_4_ = auVar6._8_4_ * 3.0;
                      auVar202._12_4_ = auVar6._12_4_ * 3.0;
                      auVar154._4_4_ = fVar102;
                      auVar154._0_4_ = fVar102;
                      auVar154._8_4_ = fVar102;
                      auVar154._12_4_ = fVar102;
                      auVar6 = vfmadd132ps_fma(auVar154,auVar110,local_388);
                      auVar110 = vshufps_avx(auVar202,auVar202,0xc9);
                      auVar140._0_4_ = auVar6._0_4_ * auVar110._0_4_;
                      auVar140._4_4_ = auVar6._4_4_ * auVar110._4_4_;
                      auVar140._8_4_ = auVar6._8_4_ * auVar110._8_4_;
                      auVar140._12_4_ = auVar6._12_4_ * auVar110._12_4_;
                      auVar110 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar110 = vfmsub231ps_fma(auVar140,auVar202,auVar110);
                      local_248 = auVar110._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar77;
                        uVar76 = vextractps_avx(auVar110,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar76;
                        uVar76 = vextractps_avx(auVar110,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar76;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = local_248;
                        *(float *)(ray + k * 4 + 0xf0) = local_238;
                        *(float *)(ray + k * 4 + 0x100) = fVar144;
                        *(uint *)(ray + k * 4 + 0x110) = uVar8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar65;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar6 = vshufps_avx(auVar110,auVar110,0x55);
                        auVar110 = vshufps_avx(auVar110,auVar110,0xaa);
                        local_268[0] = (RTCHitN)auVar6[0];
                        local_268[1] = (RTCHitN)auVar6[1];
                        local_268[2] = (RTCHitN)auVar6[2];
                        local_268[3] = (RTCHitN)auVar6[3];
                        local_268[4] = (RTCHitN)auVar6[4];
                        local_268[5] = (RTCHitN)auVar6[5];
                        local_268[6] = (RTCHitN)auVar6[6];
                        local_268[7] = (RTCHitN)auVar6[7];
                        local_268[8] = (RTCHitN)auVar6[8];
                        local_268[9] = (RTCHitN)auVar6[9];
                        local_268[10] = (RTCHitN)auVar6[10];
                        local_268[0xb] = (RTCHitN)auVar6[0xb];
                        local_268[0xc] = (RTCHitN)auVar6[0xc];
                        local_268[0xd] = (RTCHitN)auVar6[0xd];
                        local_268[0xe] = (RTCHitN)auVar6[0xe];
                        local_268[0xf] = (RTCHitN)auVar6[0xf];
                        local_258 = auVar110;
                        uStack_244 = local_248;
                        uStack_240 = local_248;
                        uStack_23c = local_248;
                        fStack_234 = local_238;
                        fStack_230 = local_238;
                        fStack_22c = local_238;
                        local_228 = auVar83;
                        local_218 = CONCAT44(uStack_3d4,local_3d8);
                        uStack_210 = CONCAT44(uStack_3cc,uStack_3d0);
                        local_208._4_4_ = uStack_3c4;
                        local_208._0_4_ = local_3c8;
                        local_208._8_4_ = uStack_3c0;
                        local_208._12_4_ = uStack_3bc;
                        vpcmpeqd_avx2(ZEXT1632(local_208),ZEXT1632(local_208));
                        uStack_1f4 = context->user->instID[0];
                        local_1f8 = uStack_1f4;
                        uStack_1f0 = uStack_1f4;
                        uStack_1ec = uStack_1f4;
                        uStack_1e8 = context->user->instPrimID[0];
                        uStack_1e4 = uStack_1e8;
                        uStack_1e0 = uStack_1e8;
                        uStack_1dc = uStack_1e8;
                        *(float *)(ray + k * 4 + 0x80) = fVar77;
                        local_558 = *local_540;
                        uStack_550 = local_540[1];
                        local_538.valid = (int *)&local_558;
                        local_538.geometryUserPtr = pGVar9->userPtr;
                        local_538.context = context->user;
                        local_538.hit = local_268;
                        local_538.N = 4;
                        local_538.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->intersectionFilterN)(&local_538);
                          auVar101._8_56_ = extraout_var;
                          auVar101._0_8_ = extraout_XMM1_Qa;
                          auVar110 = auVar101._0_16_;
                        }
                        auVar60._8_8_ = uStack_550;
                        auVar60._0_8_ = local_558;
                        if (auVar60 == (undefined1  [16])0x0) {
                          auVar83 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar110 = vpcmpeqd_avx(auVar110,auVar110);
                          auVar83 = auVar83 ^ auVar110;
                        }
                        else {
                          p_Var10 = context->args->filter;
                          auVar110 = vpcmpeqd_avx(auVar83,auVar83);
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var10)(&local_538);
                            auVar110 = vpcmpeqd_avx(auVar110,auVar110);
                          }
                          auVar61._8_8_ = uStack_550;
                          auVar61._0_8_ = local_558;
                          auVar6 = vpcmpeqd_avx(auVar61,_DAT_01feba10);
                          auVar83 = auVar6 ^ auVar110;
                          if (auVar61 != (undefined1  [16])0x0) {
                            auVar6 = auVar6 ^ auVar110;
                            auVar110 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])local_538.hit);
                            *(undefined1 (*) [16])(local_538.ray + 0xc0) = auVar110;
                            auVar110 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])
                                                              (local_538.hit + 0x10));
                            *(undefined1 (*) [16])(local_538.ray + 0xd0) = auVar110;
                            auVar110 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])
                                                              (local_538.hit + 0x20));
                            *(undefined1 (*) [16])(local_538.ray + 0xe0) = auVar110;
                            auVar110 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])
                                                              (local_538.hit + 0x30));
                            *(undefined1 (*) [16])(local_538.ray + 0xf0) = auVar110;
                            auVar110 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])
                                                              (local_538.hit + 0x40));
                            *(undefined1 (*) [16])(local_538.ray + 0x100) = auVar110;
                            auVar110 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])
                                                              (local_538.hit + 0x50));
                            *(undefined1 (*) [16])(local_538.ray + 0x110) = auVar110;
                            auVar110 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])
                                                              (local_538.hit + 0x60));
                            *(undefined1 (*) [16])(local_538.ray + 0x120) = auVar110;
                            auVar110 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])
                                                              (local_538.hit + 0x70));
                            *(undefined1 (*) [16])(local_538.ray + 0x130) = auVar110;
                            auVar110 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])
                                                              (local_538.hit + 0x80));
                            *(undefined1 (*) [16])(local_538.ray + 0x140) = auVar110;
                          }
                        }
                        auVar97._8_8_ = 0x100000001;
                        auVar97._0_8_ = 0x100000001;
                        if ((auVar97 & auVar83) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar160;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar70 = lVar70 + -1;
            } while (lVar70 != 0);
          }
          else {
            bVar54 = false;
          }
        }
      }
    } while (bVar54);
    local_378 = vinsertps_avx(auVar13,ZEXT416((uint)fVar157),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }